

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImGuizmo.cpp
# Opt level: O3

void ImGuizmo::Manipulate
               (float *view,float *projection,OPERATION operation,MODE mode,float *matrix,
               float *deltaMatrix,float *snap,float *localBounds,float *boundsSnap)

{
  undefined4 uVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  char cVar4;
  ImU32 col;
  undefined1 auVar5 [16];
  ImVec2 IVar6;
  ImVec2 IVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  ImVec2 IVar10;
  ImVec2 IVar11;
  undefined1 auVar12 [16];
  ImVec2 IVar13;
  ImVec2 IVar14;
  ImVec2 IVar15;
  ImVec2 IVar16;
  ImVec2 IVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  ImVec2 IVar20;
  ImVec2 IVar21;
  ImVec2 IVar22;
  ImVec2 IVar23;
  ImVec2 IVar24;
  ImVec2 IVar25;
  undefined1 auVar26 [12];
  undefined1 auVar27 [16];
  ImVec2 *pIVar28;
  MODE MVar29;
  undefined1 auVar30 [8];
  int i;
  ImGuiIO *pIVar31;
  undefined4 extraout_var;
  undefined8 extraout_RAX;
  long lVar32;
  undefined4 extraout_var_00;
  ulong uVar33;
  undefined4 extraout_var_01;
  ImVec2 IVar34;
  char *buf;
  vec_t *pvVar35;
  ulong uVar36;
  undefined8 extraout_RDX;
  ImGuiIO *extraout_RDX_00;
  ImGuiIO *extraout_RDX_01;
  vec_t *extraout_RDX_02;
  vec_t *plan;
  vec_t *extraout_RDX_03;
  vec_t *plan_00;
  vec_t *plan_01;
  undefined8 *puVar37;
  ImVec2 IVar38;
  bool bVar39;
  int iVar40;
  byte bVar41;
  undefined4 uVar42;
  vec_t *pvVar43;
  undefined4 uVar44;
  matrix_t *srcMatrix;
  uint i_1;
  int iVar45;
  uint uVar46;
  ImVec2 IVar47;
  int axisIndex;
  int j;
  ImVec2 IVar53;
  undefined4 extraout_XMM0_Db;
  ImVec2 IVar54;
  undefined1 *puVar48;
  long lVar49;
  bool bVar50;
  int iVar51;
  undefined1 auVar52 [4];
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar55 [16];
  undefined8 extraout_XMM0_Qb;
  undefined1 extraout_var_02 [12];
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar56 [16];
  undefined8 extraout_XMM0_Qb_01;
  undefined4 extraout_XMM0_Dd;
  undefined8 extraout_XMM0_Qb_02;
  undefined8 extraout_XMM0_Qb_03;
  float fVar57;
  undefined1 auVar58 [16];
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  bool belowPlaneLimit;
  matrix_t viewInverse;
  matrix_t matT_3;
  ImVec2 midBound;
  matrix_t matT;
  int indices [2];
  matrix_t matT_11;
  matrix_t matT_2;
  matrix_t res_1;
  bool local_709;
  undefined1 local_708 [4];
  undefined1 auStack_704 [4];
  undefined8 uStack_700;
  ImVec2 local_6f8;
  undefined8 uStack_6f0;
  bool local_6d9;
  undefined1 local_6d8 [8];
  float fStack_6d0;
  float fStack_6cc;
  float local_6c0;
  float local_6bc;
  ImVec2 local_6b8;
  undefined8 uStack_6b0;
  ulong local_6a0;
  ImVec2 local_698;
  ulong uStack_690;
  ImVec2 *local_680;
  OPERATION local_674;
  float local_670;
  float local_66c;
  ImVec2 local_668;
  undefined8 uStack_660;
  ulong local_658;
  ImGuiIO *local_650;
  undefined1 local_648 [4];
  float afStack_644 [17];
  ImVec2 local_600;
  vec_t local_5f8;
  float fStack_5e8;
  float fStack_5e4;
  float fStack_5e0;
  undefined4 uStack_5dc;
  ImVec2 IStack_5d8;
  float local_5d0 [6];
  undefined1 local_5b8 [16];
  vec_t local_5a8;
  undefined4 uStack_598;
  undefined4 local_594;
  undefined8 local_590;
  undefined8 uStack_588;
  undefined4 local_580;
  undefined4 uStack_57c;
  uint uStack_578;
  uint uStack_574;
  uint local_570;
  undefined4 local_56c;
  undefined1 local_568 [16];
  undefined1 local_558 [16];
  undefined1 local_548 [16];
  long local_538;
  long local_530;
  float local_528;
  float fStack_524;
  float afStack_520 [2];
  undefined1 local_518 [8];
  ImVec2 aIStack_510 [11];
  float local_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  undefined1 local_308 [12];
  undefined8 uStack_2fc;
  undefined4 local_2f4;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined4 local_2e0;
  undefined4 uStack_2dc;
  uint uStack_2d8;
  uint uStack_2d4;
  uint local_2d0;
  undefined4 local_2cc;
  ImVec2 local_2c8 [8];
  undefined1 local_288 [16];
  ImU32 local_278 [124];
  ImVec2 local_88;
  ImVec2 IStack_80;
  ImVec2 local_78;
  ImVec2 IStack_70;
  ImVec2 local_68;
  ImVec2 IStack_60;
  ImVec2 local_58;
  ImVec2 IStack_50;
  vec_t local_48;
  
  _DAT_001fbfec = *(undefined8 *)view;
  uRam00000000001fbff4 = *(undefined8 *)(view + 2);
  _DAT_001fbffc = *(undefined8 *)(view + 4);
  uRam00000000001fc004 = *(undefined8 *)(view + 6);
  _DAT_001fc00c = *(undefined8 *)(view + 8);
  uRam00000000001fc014 = *(undefined8 *)(view + 10);
  _DAT_001fc01c = *(undefined8 *)(view + 0xc);
  uRam00000000001fc024 = *(undefined8 *)(view + 0xe);
  _DAT_001fc02c = *(undefined8 *)projection;
  uRam00000000001fc034 = *(undefined8 *)(projection + 2);
  _DAT_001fc03c = *(undefined8 *)(projection + 4);
  uRam00000000001fc044 = *(undefined8 *)(projection + 6);
  _DAT_001fc04c = *(undefined8 *)(projection + 8);
  uRam00000000001fc054 = *(undefined8 *)(projection + 10);
  _DAT_001fc05c = *(undefined8 *)(projection + 0xc);
  uRam00000000001fc064 = *(undefined8 *)(projection + 0xe);
  uStack_700 = _local_708;
  _local_708 = (ImVec2 *)deltaMatrix;
  DAT_001fbfe8 = mode;
  local_674 = operation;
  if (mode == LOCAL) {
    _DAT_001fc084 = *(undefined8 *)(matrix + 6);
    _DAT_001fc08c = *(undefined8 *)(matrix + 8);
    _DAT_001fc094 = *(undefined8 *)(matrix + 10);
    _DAT_001fc09c = *(ImVec2 *)(matrix + 0xc);
    _DAT_001fc0a4 = *(ImVec2 *)(matrix + 0xe);
    _DAT_001fc07c = (float)*(undefined8 *)(matrix + 4);
    _DAT_001fc080 = (float)((ulong)*(undefined8 *)(matrix + 4) >> 0x20);
    _DAT_001fc06c = (float)*(undefined8 *)matrix;
    _DAT_001fc070 = (float)((ulong)*(undefined8 *)matrix >> 0x20);
    _DAT_001fc074 = (float)*(undefined8 *)(matrix + 2);
    fRam00000000001fc078 = (float)((ulong)*(undefined8 *)(matrix + 2) >> 0x20);
    matrix_t::OrthoNormalize((matrix_t *)&DAT_001fc06c);
  }
  else {
    _DAT_001fc06c = 1.0;
    _DAT_001fc070 = 0.0;
    _DAT_001fc074 = 0.0;
    fRam00000000001fc078 = 0.0;
    _DAT_001fc07c = 0.0;
    _DAT_001fc080 = 1.0;
    _DAT_001fc084 = 0;
    _DAT_001fc08c = 0;
    _DAT_001fc094 = 0x3f800000;
    _DAT_001fc09c = *(ImVec2 *)(matrix + 0xc);
    DAT_001fc0a8 = 1.0;
    DAT_001fc0a4 = matrix[0xe];
  }
  _DAT_001fc0ec = matrix[0];
  _DAT_001fc0f0 = matrix[1];
  uVar2 = *(undefined8 *)*(undefined1 (*) [12])(matrix + 2);
  auVar26 = *(undefined1 (*) [12])(matrix + 2);
  _DAT_001fc104 = *(undefined8 *)(matrix + 6);
  _DAT_001fc10c = *(ImVec2 *)(matrix + 8);
  _DAT_001fc114 = *(ImVec2 *)(matrix + 10);
  _DAT_001fc11c = *(ImVec2 *)(matrix + 0xc);
  _DAT_001fc124 = *(ImVec2 *)(matrix + 0xe);
  _DAT_001fc0f4 = (float)uVar2;
  fRam00000000001fc0f8 = (float)((ulong)uVar2 >> 0x20);
  DAT_001fc0fc = (float)*(undefined8 *)(matrix + 4);
  DAT_001fc100 = (float)((ulong)*(undefined8 *)(matrix + 4) >> 0x20);
  auVar55._12_4_ = DAT_001fc100;
  auVar55._0_12_ = auVar26;
  DAT_001fc1f4 = SQRT(DAT_001fc114 * DAT_001fc114 +
                      DAT_001fc10c * DAT_001fc10c + DAT_001fc110 * DAT_001fc110);
  auVar58._0_4_ =
       auVar26._0_4_ * auVar26._0_4_ + _DAT_001fc0ec * _DAT_001fc0ec + _DAT_001fc0f0 * _DAT_001fc0f0
  ;
  auVar58._4_4_ =
       DAT_001fc104 * DAT_001fc104 + DAT_001fc0fc * DAT_001fc0fc + DAT_001fc100 * DAT_001fc100;
  auVar58._8_4_ =
       auVar26._8_4_ * auVar26._8_4_ +
       _DAT_001fc0f4 * _DAT_001fc0f4 + fRam00000000001fc0f8 * fRam00000000001fc0f8;
  auVar58._12_4_ =
       DAT_001fc100 * DAT_001fc100 +
       fRam00000000001fc0f8 * fRam00000000001fc0f8 + DAT_001fc0fc * DAT_001fc0fc;
  auVar55 = sqrtps(auVar55,auVar58);
  _DAT_001fc1ec = auVar55._0_8_;
  _DAT_001fc1f8 = 0;
  local_680 = (ImVec2 *)matrix;
  matrix_t::Inverse((matrix_t *)&DAT_001fc0ac,(matrix_t *)&DAT_001fc06c,false);
  matrix_t::Inverse((matrix_t *)&DAT_001fc12c,(matrix_t *)&DAT_001fc0ec,false);
  FPU_MatrixF_x_MatrixF((float *)&DAT_001fbfec,(float *)&DAT_001fc02c,(float *)local_518);
  _DAT_001fc1ac = CONCAT44(local_518._4_4_,local_518._0_4_);
  uRam00000000001fc1b4 = CONCAT44(aIStack_510[0].y,aIStack_510[0].x);
  _DAT_001fc1bc = CONCAT44(aIStack_510[1].y,aIStack_510[1].x);
  uRam00000000001fc1c4 = CONCAT44(aIStack_510[2].y,aIStack_510[2].x);
  _DAT_001fc1cc = CONCAT44(aIStack_510[3].y,aIStack_510[3].x);
  uRam00000000001fc1d4 = CONCAT44(aIStack_510[4].y,aIStack_510[4].x);
  _DAT_001fc1dc = CONCAT44(aIStack_510[5].y,aIStack_510[5].x);
  uRam00000000001fc1e4 = CONCAT44(aIStack_510[6].y,aIStack_510[6].x);
  FPU_MatrixF_x_MatrixF((float *)&DAT_001fc06c,(float *)&DAT_001fc1ac,(float *)local_518);
  _DAT_001fc16c = CONCAT44(local_518._4_4_,local_518._0_4_);
  uRam00000000001fc174 = CONCAT44(aIStack_510[0].y,aIStack_510[0].x);
  _DAT_001fc17c = CONCAT44(aIStack_510[1].y,aIStack_510[1].x);
  uRam00000000001fc184 = CONCAT44(aIStack_510[2].y,aIStack_510[2].x);
  _DAT_001fc18c = CONCAT44(aIStack_510[3].y,aIStack_510[3].x);
  uRam00000000001fc194 = CONCAT44(aIStack_510[4].y,aIStack_510[4].x);
  _DAT_001fc19c = CONCAT44(aIStack_510[5].y,aIStack_510[5].x);
  uRam00000000001fc1a4 = CONCAT44(aIStack_510[6].y,aIStack_510[6].x);
  matrix_t::Inverse((matrix_t *)local_648,(matrix_t *)&DAT_001fbfec,false);
  uRam00000000001fc214 = CONCAT44(afStack_644[2],afStack_644[1]);
  _DAT_001fc22c = CONCAT44(afStack_644[4],afStack_644[3]);
  uRam00000000001fc234 = CONCAT44(afStack_644[6],afStack_644[5]);
  _DAT_001fc21c = afStack_644[7];
  DAT_001fc21c_4 = afStack_644[8];
  IRam00000000001fc224.x = afStack_644[9];
  IRam00000000001fc224.y = afStack_644[10];
  DAT_001fc1fc = afStack_644[0xb];
  DAT_001fc200 = afStack_644[0xc];
  DAT_001fc204 = afStack_644[0xd];
  DAT_001fc204_4 = afStack_644[0xe];
  _DAT_001fc20c = (float)local_648;
  DAT_001fc20c_4 = afStack_644[0];
  local_518._0_4_ = DAT_001fc09c;
  local_518._4_4_ = DAT_001fc0a0;
  aIStack_510[0].x = DAT_001fc0a4;
  aIStack_510[0].y = 1.0;
  vec_t::Transform((vec_t *)local_518,(matrix_t *)&DAT_001fc1ac);
  DAT_001fc274 = aIStack_510[0].y * 0.1;
  local_518._0_4_ = 0.0;
  local_518._4_4_ = 0.0;
  aIStack_510[0].x = 0.0;
  aIStack_510[0].y = 0.0;
  _DAT_001fc25c = worldToPos((vec_t *)local_518,(matrix_t *)&DAT_001fc16c);
  _DAT_001fc264 = (float)DAT_001fc25c + -10.0;
  DAT_001fc268 = DAT_001fc25c._4_4_ + -10.0;
  DAT_001fc26c = (float)DAT_001fc25c + 10.0;
  DAT_001fc270 = DAT_001fc25c._4_4_ + 10.0;
  pIVar31 = ImGui::GetIO();
  srcMatrix = (matrix_t *)local_288;
  FPU_MatrixF_x_MatrixF((float *)&DAT_001fbfec,(float *)&DAT_001fc02c,(float *)srcMatrix);
  matrix_t::Inverse((matrix_t *)local_518,srcMatrix,false);
  fVar61 = ((pIVar31->MousePos).x - (float)DAT_001fc3a0) / (float)DAT_001fc3a8;
  fVar57 = 1.0 - ((pIVar31->MousePos).y - DAT_001fc3a0._4_4_) / DAT_001fc3a8._4_4_;
  DAT_001fc23c = fVar61 + fVar61 + -1.0;
  DAT_001fc240 = fVar57 + fVar57 + -1.0;
  local_6f8.y = DAT_001fc240;
  local_6f8.x = DAT_001fc23c;
  uStack_6f0 = 0;
  _DAT_001fc244 = (ImVec2)0x3f80000000000000;
  vec_t::Transform((vec_t *)&DAT_001fc23c,(matrix_t *)local_518);
  fVar57 = 1.0 / DAT_001fc244_4;
  DAT_001fc23c = fVar57 * DAT_001fc23c;
  DAT_001fc240 = fVar57 * DAT_001fc240;
  DAT_001fc244 = fVar57 * DAT_001fc244;
  DAT_001fc244_4 = fVar57 * DAT_001fc244_4;
  fVar61 = aIStack_510[6].y +
           aIStack_510[4].y + aIStack_510[0].y * local_6f8.x + aIStack_510[2].y * local_6f8.y;
  fVar62 = 1.0 / fVar61;
  fVar59 = (aIStack_510[5].x +
           aIStack_510[3].x + local_6f8.x * (float)local_518._0_4_ + local_6f8.y * aIStack_510[1].x)
           * fVar62 - DAT_001fc23c;
  fVar60 = (aIStack_510[5].y +
           aIStack_510[3].y + local_6f8.x * (float)local_518._4_4_ + local_6f8.y * aIStack_510[1].y)
           * fVar62 - DAT_001fc240;
  fVar57 = (aIStack_510[6].x +
           aIStack_510[4].x + aIStack_510[0].x * local_6f8.x + aIStack_510[2].x * local_6f8.y) *
           fVar62 - DAT_001fc244;
  fRam00000000001fc258 = 1.0 / SQRT(fVar57 * fVar57 + fVar59 * fVar59 + fVar60 * fVar60);
  local_48 = (vec_t)ZEXT416(0);
  DAT_001fc24c = fVar59 * fRam00000000001fc258;
  DAT_001fc250 = fVar60 * fRam00000000001fc258;
  DAT_001fc254 = fRam00000000001fc258 * fVar57;
  fRam00000000001fc258 = fRam00000000001fc258 * (fVar61 * fVar62 - DAT_001fc244_4);
  if (_local_708 != (ImVec2 *)0x0) {
    _local_708->x = 0x3f800000;
    *(vec_t *)((long)_local_708 + 4) = local_48;
    *(undefined4 *)((long)_local_708 + 0x14) = 0x3f800000;
    *(vec_t *)((long)_local_708 + 0x18) = local_48;
    *(undefined4 *)((long)_local_708 + 0x28) = 0x3f800000;
    *(vec_t *)((long)_local_708 + 0x2c) = local_48;
    *(undefined4 *)((long)_local_708 + 0x3c) = 0x3f800000;
  }
  pvVar43 = (vec_t *)&DAT_001fc16c;
  vec_t::TransformPoint(&local_48,(matrix_t *)&DAT_001fc16c);
  if (local_48.z < 0.001) {
    return;
  }
  uVar36 = 0;
  if ((DAT_001fc289 != '\x01') || (DAT_001fc358 != '\0')) goto LAB_001304ad;
  if (local_674 == TRANSLATE) {
    pIVar31 = ImGui::GetIO();
    MVar29 = DAT_001fbfe8;
    if (DAT_001fc288 != '\x01') {
      uVar46 = GetMoveType((vec_t *)local_288);
      uVar36 = CONCAT44(extraout_var_01,uVar46);
      if ((uVar46 != 0) && (pIVar31->MouseDown[0] != false)) {
        _DAT_001fc288 = (float)CONCAT31(_DAT_001fc289,1);
        local_518._0_4_ = _DAT_001fc07c;
        local_518._4_4_ = _DAT_001fc080;
        aIStack_510[0].x = (float)_DAT_001fc084;
        aIStack_510[0].y = (float)((ulong)_DAT_001fc084 >> 0x20);
        aIStack_510[1].x = (float)_DAT_001fc08c;
        aIStack_510[1].y = (float)((ulong)_DAT_001fc08c >> 0x20);
        aIStack_510[2].x = (float)_DAT_001fc094;
        aIStack_510[2].y = (float)((ulong)_DAT_001fc094 >> 0x20);
        aIStack_510[3].x = _DAT_001fc06c;
        aIStack_510[3].y = _DAT_001fc070;
        aIStack_510[4].x = _DAT_001fc074;
        aIStack_510[4].y = fRam00000000001fc078;
        aIStack_510[7].x = _DAT_001fc06c;
        aIStack_510[7].y = _DAT_001fc070;
        aIStack_510[8].x = _DAT_001fc074;
        aIStack_510[8].y = fRam00000000001fc078;
        aIStack_510[9].x = _DAT_001fc07c;
        aIStack_510[9].y = _DAT_001fc080;
        aIStack_510[10].x = (float)_DAT_001fc084;
        aIStack_510[10].y = (float)DAT_001fc084_4;
        local_4b8 = -_DAT_001fc21c;
        fStack_4b4 = -DAT_001fc21c_4;
        fStack_4b0 = -IRam00000000001fc224.x;
        fStack_4ac = -IRam00000000001fc224.y;
        lVar32 = (long)(int)uVar46 * 0x10;
        fVar57 = *(float *)(lVar32 + -8 + (long)local_518);
        uVar2 = *(undefined8 *)(lVar32 + -0x10 + (long)local_518);
        _DAT_001fc28c = (float)uVar2;
        _DAT_001fc290 = (float)((ulong)uVar2 >> 0x20);
        fVar61 = 1.0 / SQRT(fVar57 * fVar57 +
                            _DAT_001fc28c * _DAT_001fc28c + _DAT_001fc290 * _DAT_001fc290);
        _DAT_001fc28c = fVar61 * _DAT_001fc28c;
        _DAT_001fc290 = fVar61 * _DAT_001fc290;
        local_6b8.y = DAT_001fc250;
        local_6b8.x = DAT_001fc24c;
        uStack_6b0 = 0;
        _fStack_6d0 = 0;
        local_6d8._0_4_ = DAT_001fc23c;
        local_6d8._4_4_ = DAT_001fc240;
        local_6f8.y = fRam00000000001fc258;
        local_6f8.x = DAT_001fc254;
        uStack_6f0 = 0;
        uStack_700 = 0;
        local_708 = (undefined1  [4])DAT_001fc244;
        auStack_704 = (undefined1  [4])DAT_001fc244_4;
        local_698 = _DAT_001fc0a4;
        uStack_690 = 0;
        local_668 = _DAT_001fc09c;
        uStack_660 = 0;
        _DAT_001fc294 =
             CONCAT44(DAT_001fc0a4._4_4_ * fVar61 * *(float *)(lVar32 + -4 + (long)local_518) +
                      fVar57 * fVar61 * DAT_001fc0a4 +
                      _DAT_001fc28c * DAT_001fc09c + DAT_001fc09c._4_4_ * _DAT_001fc290,
                      fVar57 * fVar61);
        DAT_001fc39c = uVar46;
        aIStack_510[5].x = aIStack_510[1].x;
        aIStack_510[5].y = aIStack_510[1].y;
        aIStack_510[6].x = aIStack_510[2].x;
        aIStack_510[6].y = aIStack_510[2].y;
        fVar57 = IntersectRayPlane((vec_t *)&DAT_001fc28c,pvVar43,plan_01);
        fVar60 = local_6b8.x * fVar57 + (float)local_6d8._0_4_;
        fVar62 = local_6b8.y * fVar57 + (float)local_6d8._4_4_;
        fVar61 = fVar57 * local_6f8.x + (float)local_708;
        fVar57 = fVar57 * local_6f8.y + (float)auStack_704;
        _DAT_001fc2a4 = CONCAT44(fVar57,fVar61);
        _DAT_001fc29c = CONCAT44(fVar62,fVar60);
        DAT_001fc2ac = _DAT_001fc09c;
        DAT_001fc2b4 = _DAT_001fc0a4;
        fVar59 = 1.0 / DAT_001fc274;
        _DAT_001fc278 = (fVar60 - local_668.x) * fVar59;
        DAT_001fc27c = (fVar62 - local_668.y) * fVar59;
        DAT_001fc280 = fVar59 * (fVar61 - local_698.x);
        DAT_001fc284 = fVar59 * (fVar57 - local_698.y);
      }
      goto LAB_001304ad;
    }
    fVar57 = IntersectRayPlane((vec_t *)&DAT_001fc28c,pvVar43,plan_00);
    aIStack_510[5].x =
         ((DAT_001fc23c + DAT_001fc24c * fVar57) - DAT_001fc274 * _DAT_001fc278) - DAT_001fc09c;
    aIStack_510[5].y =
         ((DAT_001fc23c._4_4_ + DAT_001fc250 * fVar57) - DAT_001fc27c * DAT_001fc274) -
         DAT_001fc09c._4_4_;
    fVar60 = ((fVar57 * 0.0 + 0.0) - 0.0) - 0.0;
    fVar62 = ((fVar57 * 0.0 + 0.0) - 0.0) - 0.0;
    aIStack_510[6].x =
         ((DAT_001fc244 + DAT_001fc254 * fVar57) - DAT_001fc274 * DAT_001fc280) - DAT_001fc0a4;
    fVar61 = ((DAT_001fc244._4_4_ + fRam00000000001fc258 * fVar57) - DAT_001fc284 * DAT_001fc274) -
             DAT_001fc0a4._4_4_;
    fVar59 = ((fVar57 * 0.0 + 0.0) - _DAT_001fc288 * 0.0) - 0.0;
    fVar57 = ((fVar57 * 0.0 + 0.0) - _DAT_001fc28c * 0.0) - 0.0;
    if (DAT_001fc39c - 1 < 3) {
      lVar32 = (ulong)(DAT_001fc39c - 1) * 0x10;
      fVar61 = (float)*(undefined8 *)(&DAT_001fc06c + lVar32);
      fVar59 = (float)((ulong)*(undefined8 *)(&DAT_001fc06c + lVar32) >> 0x20);
      fVar63 = (float)*(undefined8 *)(&DAT_001fc074 + lVar32);
      fVar57 = aIStack_510[6].x * fVar63 + aIStack_510[5].y * fVar59 + fVar61 * aIStack_510[5].x;
      aIStack_510[5].x = fVar61 * fVar57;
      aIStack_510[5].y = fVar59 * fVar57;
      fVar60 = fVar57 * 0.0;
      fVar62 = fVar57 * 0.0;
      aIStack_510[6].x = fVar57 * fVar63;
      fVar61 = fVar57 * (float)((ulong)*(undefined8 *)(&DAT_001fc074 + lVar32) >> 0x20);
      fVar59 = fVar57 * 0.0;
      fVar57 = fVar57 * 0.0;
    }
    if (snap == (float *)0x0) {
    }
    else {
      fVar63 = (DAT_001fc09c + aIStack_510[5].x) - DAT_001fc2ac.x;
      fVar64 = (DAT_001fc09c._4_4_ + aIStack_510[5].y) - DAT_001fc2ac.y;
      afStack_644[1] = (DAT_001fc0a4 + aIStack_510[6].x) - DAT_001fc2b4.x;
      afStack_644[2] = (DAT_001fc0a4._4_4_ + fVar61) - DAT_001fc2b4.y;
      afStack_644[0] = fVar64;
      local_648 = (undefined1  [4])fVar63;
      if (MVar29 == LOCAL) {
        aIStack_510[5].x = DAT_001fc11c;
        aIStack_510[5].y = DAT_001fc11c._4_4_;
        aIStack_510[6].x = DAT_001fc124;
        aIStack_510[6].y = DAT_001fc124._4_4_;
        aIStack_510[3].x = DAT_001fc10c;
        aIStack_510[3].y = DAT_001fc10c._4_4_;
        aIStack_510[4].x = DAT_001fc114;
        aIStack_510[4].y = DAT_001fc114._4_4_;
        aIStack_510[1].x = DAT_001fc0fc;
        aIStack_510[1].y = DAT_001fc100;
        aIStack_510[2].x = (float)_DAT_001fc104;
        aIStack_510[2].y = (float)((ulong)_DAT_001fc104 >> 0x20);
        local_518._0_4_ = (undefined4)DAT_001fc0ec;
        local_518._4_4_ = DAT_001fc0ec._4_4_;
        aIStack_510[0].x = _DAT_001fc0f4;
        aIStack_510[0].y = fRam00000000001fc0f8;
        local_6d8._4_4_ = fVar64;
        local_6d8._0_4_ = fVar63;
        fStack_6d0 = (fVar60 + 0.0) - 0.0;
        fStack_6cc = (fVar62 + 0.0) - 0.0;
        local_6f8.y = afStack_644[2];
        local_6f8.x = afStack_644[1];
        uStack_6f0 = CONCAT44((fVar57 + 0.0) - 0.0,(fVar59 + 0.0) - 0.0);
        matrix_t::OrthoNormalize((matrix_t *)local_518);
        lVar32 = 0;
        matrix_t::Inverse((matrix_t *)local_288,(matrix_t *)local_518,false);
        afStack_644[1] =
             local_6f8.x * (float)local_278[6] +
             (float)local_6d8._0_4_ * (float)local_288._8_4_ +
             (float)local_6d8._4_4_ * (float)local_278[2];
        afStack_644[2] =
             local_6f8.x * (float)local_278[7] +
             (float)local_6d8._0_4_ * (float)local_288._12_4_ +
             (float)local_6d8._4_4_ * (float)local_278[3];
        afStack_644[0] =
             local_6f8.x * (float)local_278[5] +
             (float)local_6d8._0_4_ * (float)local_288._4_4_ +
             (float)local_6d8._4_4_ * (float)local_278[1];
        local_648 = (undefined1  [4])
                    (local_6f8.x * (float)local_278[4] +
                    (float)local_6d8._0_4_ * (float)local_288._0_4_ +
                    (float)local_6d8._4_4_ * (float)local_278[0]);
        do {
          ComputeSnap((float *)(local_648 + lVar32),*(float *)((long)snap + lVar32));
          lVar32 = lVar32 + 4;
        } while (lVar32 != 0xc);
        auVar52 = (undefined1  [4])
                  (afStack_644[1] * aIStack_510[3].x +
                  (float)local_648 * (float)local_518._0_4_ + afStack_644[0] * aIStack_510[1].x);
        fVar57 = afStack_644[1] * aIStack_510[3].y +
                 (float)local_648 * (float)local_518._4_4_ + afStack_644[0] * aIStack_510[1].y;
        fVar61 = afStack_644[1] * aIStack_510[4].x +
                 (float)local_648 * aIStack_510[0].x + afStack_644[0] * aIStack_510[2].x;
      }
      else {
        lVar32 = 0;
        do {
          ComputeSnap((float *)(local_648 + lVar32),*(float *)((long)snap + lVar32));
          lVar32 = lVar32 + 4;
        } while (lVar32 != 0xc);
        auVar52 = local_648;
        fVar57 = afStack_644[0];
        fVar61 = afStack_644[1];
      }
      aIStack_510[5].x = (DAT_001fc2ac.x + (float)auVar52) - DAT_001fc09c;
      aIStack_510[5].y = (DAT_001fc2ac.y + fVar57) - DAT_001fc09c._4_4_;
      aIStack_510[6].x = (fVar61 + DAT_001fc2b4.x) - DAT_001fc0a4;
    }
    local_518._0_4_ = 1.0;
    local_518._4_4_ = 0.0;
    aIStack_510[0].x = 0.0;
    aIStack_510[0].y = 0.0;
    aIStack_510[1].x = 0.0;
    aIStack_510[1].y = 1.0;
    aIStack_510[2].x = 0.0;
    aIStack_510[2].y = 0.0;
    aIStack_510[3].x = 0.0;
    aIStack_510[3].y = 0.0;
    aIStack_510[4].x = 1.0;
    aIStack_510[4].y = 0.0;
    aIStack_510[6].y = 1.0;
    if (_local_708 != (ImVec2 *)0x0) {
      *(ulong *)((long)_local_708 + 0x30) = CONCAT44(aIStack_510[5].y,aIStack_510[5].x);
      *(float *)((long)_local_708 + 0x38) = aIStack_510[6].x;
      *(undefined4 *)((long)_local_708 + 0x3c) = 0x3f800000;
      *(undefined8 *)((long)_local_708 + 0x20) = 0;
      *(undefined8 *)((long)_local_708 + 0x28) = 0x3f800000;
      *(undefined4 *)((long)_local_708 + 0x10) = 0;
      *(undefined4 *)((long)_local_708 + 0x14) = 0x3f800000;
      *(undefined8 *)((long)_local_708 + 0x18) = 0;
      _local_708->x = 0x3f800000;
      *(undefined8 *)((long)_local_708 + 4) = 0;
      *(undefined4 *)((long)_local_708 + 0xc) = 0;
    }
    FPU_MatrixF_x_MatrixF((float *)&DAT_001fc0ec,(float *)local_518,(float *)local_288);
    IVar54.y = (float)local_288._4_4_;
    IVar54.x = (float)local_288._0_4_;
    IVar53.y = (float)local_288._12_4_;
    IVar53.x = (float)local_288._8_4_;
    auVar19._4_4_ = local_278[1];
    auVar19._0_4_ = local_278[0];
    auVar19._8_4_ = local_278[2];
    auVar19._12_4_ = local_278[3];
    IVar21.y = (float)local_278[7];
    IVar21.x = (float)local_278[6];
    IVar23.y = (float)local_278[9];
    IVar23.x = (float)local_278[8];
    IVar25.y = (float)local_278[0xb];
    IVar25.x = (float)local_278[10];
    local_680[6] = IVar23;
    local_680[7] = IVar25;
    local_680[4].x = (float)local_278[4];
    local_680[4].y = (float)local_278[5];
    local_680[5] = IVar21;
    *(undefined1 (*) [16])(local_680 + 2) = auVar19;
    *local_680 = IVar54;
    local_680[1] = IVar53;
    cVar4 = pIVar31->MouseDown[0];
  }
  else {
    if (local_674 != SCALE) {
      if (local_674 == ROTATE) {
        pIVar31 = ImGui::GetIO();
        bVar50 = DAT_001fbfe8 == LOCAL;
        uVar36 = 0;
        bVar39 = bVar50;
        if (DAT_001fc288 == '\0') {
          uVar46 = GetRotateType();
          uVar36 = CONCAT44(extraout_var,uVar46);
          bVar39 = uVar46 == 0xb || bVar50;
          if ((uVar46 != 0) && (pIVar31->MouseDown[0] != false)) {
            _DAT_001fc288 = (float)CONCAT31(_DAT_001fc289,1);
            local_518._0_4_ = _DAT_001fc06c;
            local_518._4_4_ = _DAT_001fc070;
            aIStack_510[0].x = _DAT_001fc074;
            aIStack_510[0].y = fRam00000000001fc078;
            aIStack_510[1].x = _DAT_001fc07c;
            aIStack_510[1].y = _DAT_001fc080;
            aIStack_510[2].x = (float)_DAT_001fc084;
            aIStack_510[2].y = (float)((ulong)_DAT_001fc084 >> 0x20);
            aIStack_510[3].x = (float)_DAT_001fc08c;
            aIStack_510[3].y = (float)((ulong)_DAT_001fc08c >> 0x20);
            aIStack_510[4].x = (float)_DAT_001fc094;
            aIStack_510[4].y = (float)((ulong)_DAT_001fc094 >> 0x20);
            aIStack_510[5].x = -_DAT_001fc21c;
            aIStack_510[5].y = -DAT_001fc21c_4;
            aIStack_510[6].x = -IRam00000000001fc224.x;
            aIStack_510[6].y = -IRam00000000001fc224.y;
            lVar32 = (long)(int)(uVar46 - 8);
            pvVar35 = (vec_t *)(lVar32 * 0x10);
            if (uVar46 == 0xb || bVar50) {
              fVar57 = aIStack_510[lVar32 * 2].x;
              _DAT_001fc28c = (float)*(undefined8 *)(local_518 + lVar32 * 0x10);
              _DAT_001fc290 = (float)((ulong)*(undefined8 *)(local_518 + lVar32 * 0x10) >> 0x20);
              fVar61 = 1.0 / SQRT(fVar57 * fVar57 +
                                  _DAT_001fc28c * _DAT_001fc28c + _DAT_001fc290 * _DAT_001fc290);
              _DAT_001fc28c = fVar61 * _DAT_001fc28c;
              _DAT_001fc290 = fVar61 * _DAT_001fc290;
              _DAT_001fc294 =
                   CONCAT44(DAT_001fc0a4._4_4_ *
                            fVar61 * *(float *)((long)&pvVar35->y + (long)aIStack_510) +
                            fVar57 * fVar61 * DAT_001fc0a4 +
                            _DAT_001fc28c * DAT_001fc09c + DAT_001fc09c._4_4_ * _DAT_001fc290,
                            fVar57 * fVar61);
            }
            else {
              fVar57 = pvVar35[0x1fc3b].z;
              uVar1 = pvVar35[0x1fc3b].x;
              uVar3 = pvVar35[0x1fc3b].y;
              fVar61 = 1.0 / SQRT(fVar57 * fVar57 +
                                  (float)uVar1 * (float)uVar1 + (float)uVar3 * (float)uVar3);
              _DAT_001fc28c = fVar61 * (float)uVar1;
              _DAT_001fc290 = fVar61 * (float)uVar3;
              _DAT_001fc294 =
                   CONCAT44(fVar61 * pvVar35[0x1fc3b].w * _DAT_001fc128 +
                            DAT_001fc124 * fVar57 * fVar61 +
                            DAT_001fc11c * _DAT_001fc28c + _DAT_001fc290 * _DAT_001fc120,
                            fVar57 * fVar61);
            }
            _fStack_6d0 = 0;
            local_6d8._0_4_ = DAT_001fc0a4;
            local_6d8._4_4_ = DAT_001fc0a8;
            uStack_6f0 = 0;
            local_6f8 = _DAT_001fc09c;
            DAT_001fc39c = uVar46;
            fVar57 = IntersectRayPlane((vec_t *)&DAT_001fc28c,pvVar43,pvVar35);
            fVar60 = (DAT_001fc244 + DAT_001fc254 * fVar57) - (float)local_6d8._0_4_;
            fVar61 = (DAT_001fc23c + DAT_001fc24c * fVar57) - local_6f8.x;
            fVar59 = (DAT_001fc23c._4_4_ + DAT_001fc250 * fVar57) - local_6f8.y;
            fVar62 = 1.0 / SQRT(fVar60 * fVar60 + fVar61 * fVar61 + fVar59 * fVar59);
            _DAT_001fc2bc = CONCAT44(fVar59 * fVar62,fVar61 * fVar62);
            _DAT_001fc2c4 =
                 CONCAT44(fVar62 * ((DAT_001fc244._4_4_ + fRam00000000001fc258 * fVar57) -
                                   (float)local_6d8._4_4_),fVar62 * fVar60);
            _DAT_001fc2d0 = ComputeAngleOnPlan();
          }
        }
        if (DAT_001fc288 == '\x01') {
          DAT_001fc2cc = ComputeAngleOnPlan();
          if (snap != (float *)0x0) {
            ComputeSnap(&DAT_001fc2cc,*snap * 0.017453292);
          }
          local_6f8.x = DAT_001fc2cc;
          local_5a8.x = _DAT_001fc28c;
          local_5a8.y = _DAT_001fc290;
          local_5a8.z = (float)_DAT_001fc294;
          local_5a8.w = 0.0;
          vec_t::TransformVector(&local_5a8,(matrix_t *)&DAT_001fc0ac);
          fVar57 = 1.0 / SQRT(local_5a8.z * local_5a8.z +
                              local_5a8.x * local_5a8.x + local_5a8.y * local_5a8.y);
          local_5a8.x = fVar57 * local_5a8.x;
          local_5a8.y = fVar57 * local_5a8.y;
          local_5a8.z = fVar57 * local_5a8.z;
          local_5a8.w = fVar57 * local_5a8.w;
          matrix_t::RotationAxis((matrix_t *)local_518,&local_5a8,local_6f8.x - _DAT_001fc2d0);
          _DAT_001fc2d0 = DAT_001fc2cc;
          local_288._0_4_ = DAT_001fc1ec;
          local_288._4_4_ = 0.0;
          local_288._8_4_ = 0.0;
          local_288._12_4_ = 0.0;
          local_278[0] = 0;
          local_278[1] = (ImU32)DAT_001fc1f0;
          local_278[2] = 0;
          local_278[3] = 0;
          local_278[4] = 0;
          local_278[5] = 0;
          local_278[6] = (ImU32)DAT_001fc1f4;
          local_278[7] = 0;
          local_278[8] = 0;
          local_278[9] = 0;
          local_278[10] = 0;
          local_278[0xb] = 0x3f800000;
          if (bVar39) {
            FPU_MatrixF_x_MatrixF((float *)local_288,(float *)local_518,&local_5f8.x);
            FPU_MatrixF_x_MatrixF(&local_5f8.x,(float *)&DAT_001fc06c,(float *)local_648);
            IVar6.y = afStack_644[2];
            IVar6.x = afStack_644[1];
            auVar8._4_4_ = afStack_644[4];
            auVar8._0_4_ = afStack_644[3];
            auVar8._8_4_ = afStack_644[5];
            auVar8._12_4_ = afStack_644[6];
            local_680[6].x = afStack_644[0xb];
            local_680[6].y = afStack_644[0xc];
            local_680[7].x = afStack_644[0xd];
            local_680[7].y = afStack_644[0xe];
            local_680[4].x = afStack_644[7];
            local_680[4].y = afStack_644[8];
            local_680[5].x = afStack_644[9];
            local_680[5].y = afStack_644[10];
            *(undefined1 (*) [16])(local_680 + 2) = auVar8;
            local_680->x = (float)local_648;
            local_680->y = afStack_644[0];
            local_680[1] = IVar6;
          }
          else {
            afStack_644[7] = DAT_001fc10c;
            afStack_644[8] = DAT_001fc110;
            afStack_644[9] = DAT_001fc114;
            afStack_644[10] = DAT_001fc114_4;
            afStack_644[3] = DAT_001fc0fc;
            afStack_644[4] = DAT_001fc100;
            afStack_644[5] = (float)_DAT_001fc104;
            afStack_644[6] = (float)((ulong)_DAT_001fc104 >> 0x20);
            local_648 = (undefined1  [4])_DAT_001fc0ec;
            afStack_644[0] = _DAT_001fc0f0;
            afStack_644[1] = _DAT_001fc0f4;
            afStack_644[2] = fRam00000000001fc0f8;
            afStack_644[0xb] = 0.0;
            afStack_644[0xc] = 0.0;
            afStack_644[0xd] = 0.0;
            afStack_644[0xe] = 0.0;
            FPU_MatrixF_x_MatrixF((float *)local_648,(float *)local_518,&local_5f8.x);
            IVar10.y = local_5f8.y;
            IVar10.x = local_5f8.x;
            IVar11.y = local_5f8.w;
            IVar11.x = local_5f8.z;
            auVar12._4_4_ = fStack_5e4;
            auVar12._0_4_ = fStack_5e8;
            auVar12._8_4_ = fStack_5e0;
            auVar12._12_4_ = uStack_5dc;
            IVar13.y = local_5d0[1];
            IVar13.x = local_5d0[0];
            IVar14.y = local_5d0[3];
            IVar14.x = local_5d0[2];
            IVar15.y = local_5d0[5];
            IVar15.x = local_5d0[4];
            local_680[6] = IVar14;
            local_680[7] = IVar15;
            local_680[4] = IStack_5d8;
            local_680[5] = IVar13;
            *(undefined1 (*) [16])(local_680 + 2) = auVar12;
            *local_680 = IVar10;
            local_680[1] = IVar11;
            IVar54 = _DAT_001fc124;
            local_680[6] = _DAT_001fc11c;
            local_680[7] = IVar54;
          }
          pIVar28 = _local_708;
          if (_local_708 != (ImVec2 *)0x0) {
            FPU_MatrixF_x_MatrixF((float *)&DAT_001fc0ac,(float *)local_518,&local_5f8.x);
            FPU_MatrixF_x_MatrixF(&local_5f8.x,(float *)&DAT_001fc06c,(float *)local_648);
            IVar7.y = afStack_644[2];
            IVar7.x = afStack_644[1];
            auVar9._4_4_ = afStack_644[4];
            auVar9._0_4_ = afStack_644[3];
            auVar9._8_4_ = afStack_644[5];
            auVar9._12_4_ = afStack_644[6];
            pIVar28[6].x = afStack_644[0xb];
            pIVar28[6].y = afStack_644[0xc];
            pIVar28[7].x = afStack_644[0xd];
            pIVar28[7].y = afStack_644[0xe];
            pIVar28[4].x = afStack_644[7];
            pIVar28[4].y = afStack_644[8];
            pIVar28[5].x = afStack_644[9];
            pIVar28[5].y = afStack_644[10];
            *(undefined1 (*) [16])(pIVar28 + 2) = auVar9;
            pIVar28->x = (float)local_648;
            pIVar28->y = afStack_644[0];
            pIVar28[1] = IVar7;
          }
          if (pIVar31->MouseDown[0] == false) {
            _DAT_001fc288 = (float)((uint)_DAT_001fc288 & 0xffffff00);
          }
          uVar36 = (ulong)DAT_001fc39c;
        }
      }
      goto LAB_001304ad;
    }
    pIVar31 = ImGui::GetIO();
    uVar36 = 0;
    pvVar35 = extraout_RDX_02;
    if (DAT_001fc288 == '\0') {
      uVar46 = GetScaleType();
      uVar36 = CONCAT44(extraout_var_00,uVar46);
      pvVar35 = plan;
      if ((uVar46 != 0) && (pIVar31->MouseDown[0] != false)) {
        _DAT_001fc288 = (float)CONCAT31(_DAT_001fc289,1);
        local_518._0_4_ = _DAT_001fc07c;
        local_518._4_4_ = _DAT_001fc080;
        aIStack_510[0].x = (float)_DAT_001fc084;
        aIStack_510[0].y = (float)((ulong)_DAT_001fc084 >> 0x20);
        aIStack_510[1].x = (float)_DAT_001fc08c;
        aIStack_510[1].y = (float)((ulong)_DAT_001fc08c >> 0x20);
        aIStack_510[2].x = (float)_DAT_001fc094;
        aIStack_510[2].y = (float)((ulong)_DAT_001fc094 >> 0x20);
        aIStack_510[3].x = _DAT_001fc06c;
        aIStack_510[3].y = _DAT_001fc070;
        aIStack_510[4].x = _DAT_001fc074;
        aIStack_510[4].y = fRam00000000001fc078;
        aIStack_510[7].x = _DAT_001fc07c;
        aIStack_510[7].y = _DAT_001fc080;
        aIStack_510[8].x = (float)_DAT_001fc084;
        aIStack_510[8].y = (float)DAT_001fc084_4;
        aIStack_510[9].x = _DAT_001fc06c;
        aIStack_510[9].y = _DAT_001fc070;
        aIStack_510[10].x = _DAT_001fc074;
        aIStack_510[10].y = fRam00000000001fc078;
        local_4b8 = -_DAT_001fc21c;
        fStack_4b4 = -DAT_001fc21c_4;
        fStack_4b0 = -IRam00000000001fc224.x;
        fStack_4ac = -IRam00000000001fc224.y;
        lVar32 = (long)(int)uVar46 * 0x10;
        fVar57 = *(float *)(lVar32 + -0xb8 + (long)local_518);
        uVar2 = *(undefined8 *)((long)&((matrix_t *)local_518)[-3].field_0 + lVar32);
        _DAT_001fc28c = (float)uVar2;
        _DAT_001fc290 = (float)((ulong)uVar2 >> 0x20);
        fVar61 = 1.0 / SQRT(fVar57 * fVar57 +
                            _DAT_001fc28c * _DAT_001fc28c + _DAT_001fc290 * _DAT_001fc290);
        _DAT_001fc28c = fVar61 * _DAT_001fc28c;
        _DAT_001fc290 = fVar61 * _DAT_001fc290;
        local_698.y = DAT_001fc250;
        local_698.x = DAT_001fc24c;
        uStack_690 = 0;
        local_668 = _DAT_001fc23c;
        uStack_660 = 0;
        local_6d8._4_4_ = fRam00000000001fc258;
        local_6d8._0_4_ = DAT_001fc254;
        _fStack_6d0 = 0;
        local_6f8 = _DAT_001fc244;
        uStack_6f0 = 0;
        local_5b8._8_8_ = 0;
        local_5b8._0_4_ = DAT_001fc0a4;
        local_5b8._4_4_ = DAT_001fc0a8;
        local_6b8 = _DAT_001fc09c;
        uStack_6b0 = 0;
        _DAT_001fc294 =
             CONCAT44(DAT_001fc0a4._4_4_ * fVar61 * *(float *)(lVar32 + -0xb4 + (long)local_518) +
                      fVar57 * fVar61 * DAT_001fc0a4 +
                      _DAT_001fc28c * DAT_001fc09c + DAT_001fc09c._4_4_ * _DAT_001fc290,
                      fVar57 * fVar61);
        DAT_001fc39c = uVar46;
        aIStack_510[5].x = aIStack_510[1].x;
        aIStack_510[5].y = aIStack_510[1].y;
        aIStack_510[6].x = aIStack_510[2].x;
        aIStack_510[6].y = aIStack_510[2].y;
        fVar57 = IntersectRayPlane((vec_t *)&DAT_001fc28c,pvVar43,plan);
        fVar60 = local_698.x * fVar57 + local_668.x;
        fVar62 = local_698.y * fVar57 + local_668.y;
        fVar61 = fVar57 * (float)local_6d8._0_4_ + local_6f8.x;
        fVar57 = fVar57 * (float)local_6d8._4_4_ + local_6f8.y;
        _DAT_001fc2a4 = CONCAT44(fVar57,fVar61);
        _DAT_001fc29c = CONCAT44(fVar62,fVar60);
        DAT_001fc2ac = _DAT_001fc09c;
        DAT_001fc2b4 = _DAT_001fc0a4;
        _DAT_001fc2d4 = 0x3f8000003f800000;
        _DAT_001fc2dc = 0x3f800000;
        fVar59 = 1.0 / DAT_001fc274;
        _DAT_001fc278 = (fVar60 - local_6b8.x) * fVar59;
        DAT_001fc27c = (fVar62 - local_6b8.y) * fVar59;
        DAT_001fc280 = fVar59 * (fVar61 - (float)local_5b8._0_4_);
        DAT_001fc284 = fVar59 * (fVar57 - (float)local_5b8._4_4_);
        auVar56._0_4_ =
             _DAT_001fc0f4 * _DAT_001fc0f4 +
             _DAT_001fc0ec * _DAT_001fc0ec + _DAT_001fc0f0 * _DAT_001fc0f0;
        auVar56._4_4_ =
             DAT_001fc104 * DAT_001fc104 + DAT_001fc0fc * DAT_001fc0fc + DAT_001fc100 * DAT_001fc100
        ;
        auVar56._8_4_ =
             DAT_001fc0fc * DAT_001fc0fc +
             _DAT_001fc0f4 * _DAT_001fc0f4 + fRam00000000001fc0f8 * fRam00000000001fc0f8;
        auVar56._12_4_ =
             DAT_001fc100 * DAT_001fc100 +
             fRam00000000001fc0f8 * fRam00000000001fc0f8 + DAT_001fc0fc * DAT_001fc0fc;
        auVar55 = sqrtps(auVar56,auVar56);
        _DAT_001fc2e4 = auVar55._0_8_;
        _DAT_001fc2ec =
             SQRT(DAT_001fc114 * DAT_001fc114 +
                  DAT_001fc10c * DAT_001fc10c + DAT_001fc110 * DAT_001fc110);
        register0x0000120c = 0;
        _DAT_001fc2f4 = (pIVar31->MousePos).x;
        pvVar35 = extraout_RDX_03;
      }
    }
    if (DAT_001fc288 != '\x01') goto LAB_001304ad;
    uVar46 = DAT_001fc39c - 0xc;
    if (uVar46 < 3) {
      local_6f8.x = DAT_001fc244;
      _local_6d8 = ZEXT416((uint)DAT_001fc254);
      fVar60 = IntersectRayPlane((vec_t *)&DAT_001fc28c,pvVar43,pvVar35);
      lVar32 = (ulong)uVar46 * 0x10;
      fVar57 = *(float *)(&DAT_001fc06c + lVar32);
      fVar61 = *(float *)(&DAT_001fc070 + lVar32);
      fVar59 = *(float *)(&DAT_001fc074 + lVar32);
      fVar60 = ((((float)local_6d8._0_4_ * fVar60 + local_6f8.x) - DAT_001fc280 * DAT_001fc274) -
               DAT_001fc0a4) * fVar59 +
               (((fVar60 * DAT_001fc24c + DAT_001fc23c) - DAT_001fc274 * _DAT_001fc278) -
               DAT_001fc09c) * fVar57 +
               (((DAT_001fc250 * fVar60 + DAT_001fc240) - DAT_001fc27c * DAT_001fc274) -
               DAT_001fc0a0) * fVar61;
      fVar57 = ((fVar60 * fVar59 + (DAT_001fc2a4 - DAT_001fc0a4)) * fVar59 +
               (fVar57 * fVar60 + (DAT_001fc29c - DAT_001fc09c)) * fVar57 +
               (fVar61 * fVar60 + (DAT_001fc2a0 - DAT_001fc0a0)) * fVar61) /
               ((DAT_001fc2a4 - DAT_001fc0a4) * fVar59 +
               (DAT_001fc29c - DAT_001fc09c) * fVar57 + (DAT_001fc2a0 - DAT_001fc0a0) * fVar61);
      if (fVar57 <= 0.001) {
        fVar57 = 0.001;
      }
      (&DAT_001fc2d4)[uVar46] = fVar57;
    }
    else {
      fVar57 = ((pIVar31->MousePos).x - _DAT_001fc2f4) * 0.01 + 1.0;
      if (fVar57 <= 0.001) {
        fVar57 = 0.001;
      }
      _DAT_001fc2d4 = CONCAT44(fVar57,fVar57);
      _DAT_001fc2dc = CONCAT44(fVar57,fVar57);
    }
    if (snap != (float *)0x0) {
      local_518._0_4_ = *snap;
      local_518._4_4_ = local_518._0_4_;
      aIStack_510[0].x = (float)local_518._0_4_;
      lVar32 = 0;
      do {
        ComputeSnap((float *)((long)&DAT_001fc2d4 + lVar32),*(float *)(local_518 + lVar32));
        lVar32 = lVar32 + 4;
      } while (lVar32 != 0xc);
    }
    lVar32 = 0;
    do {
      fVar57 = (&DAT_001fc2d4)[lVar32];
      if ((&DAT_001fc2d4)[lVar32] <= 0.001) {
        fVar57 = 0.001;
      }
      (&DAT_001fc2d4)[lVar32] = fVar57;
      lVar32 = lVar32 + 1;
    } while (lVar32 != 3);
    local_518._0_4_ = DAT_001fc2d4 * _DAT_001fc2e4;
    aIStack_510[1].y = DAT_001fc2d8 * _DAT_001fc2e8;
    aIStack_510[4].x = DAT_001fc2dc * _DAT_001fc2ec;
    local_518._4_4_ = 0.0;
    aIStack_510[0].x = 0.0;
    aIStack_510[0].y = 0.0;
    aIStack_510[1].x = 0.0;
    aIStack_510[2].x = 0.0;
    aIStack_510[2].y = 0.0;
    aIStack_510[3].x = 0.0;
    aIStack_510[3].y = 0.0;
    aIStack_510[4].y = 0.0;
    aIStack_510[5].x = 0.0;
    aIStack_510[5].y = 0.0;
    aIStack_510[6].x = 0.0;
    aIStack_510[6].y = 1.0;
    FPU_MatrixF_x_MatrixF((float *)local_518,(float *)&DAT_001fc06c,(float *)local_288);
    IVar16.y = (float)local_288._4_4_;
    IVar16.x = (float)local_288._0_4_;
    IVar17.y = (float)local_288._12_4_;
    IVar17.x = (float)local_288._8_4_;
    auVar18._4_4_ = local_278[1];
    auVar18._0_4_ = local_278[0];
    auVar18._8_4_ = local_278[2];
    auVar18._12_4_ = local_278[3];
    IVar20.y = (float)local_278[7];
    IVar20.x = (float)local_278[6];
    IVar22.y = (float)local_278[9];
    IVar22.x = (float)local_278[8];
    IVar24.y = (float)local_278[0xb];
    IVar24.x = (float)local_278[10];
    local_680[6] = IVar22;
    local_680[7] = IVar24;
    local_680[4].x = (float)local_278[4];
    local_680[4].y = (float)local_278[5];
    local_680[5] = IVar20;
    *(undefined1 (*) [16])(local_680 + 2) = auVar18;
    *local_680 = IVar16;
    local_680[1] = IVar17;
    if (_local_708 != (ImVec2 *)0x0) {
      local_518._0_4_ = DAT_001fc2d4;
      local_518._4_4_ = 0.0;
      aIStack_510[0].x = 0.0;
      aIStack_510[0].y = 0.0;
      aIStack_510[1].x = 0.0;
      aIStack_510[1].y = DAT_001fc2d8;
      aIStack_510[2].x = 0.0;
      aIStack_510[2].y = 0.0;
      aIStack_510[3].x = 0.0;
      aIStack_510[3].y = 0.0;
      aIStack_510[4].x = DAT_001fc2dc;
      aIStack_510[4].y = 0.0;
      aIStack_510[5].x = 0.0;
      aIStack_510[5].y = 0.0;
      aIStack_510[6].x = 0.0;
      aIStack_510[6].y = 1.0;
      uVar36 = _DAT_001fc2d4 & 0xffffffff;
      auVar55 = ZEXT416((uint)DAT_001fc2d8);
      uVar33 = _DAT_001fc2dc & 0xffffffff;
      ((ulong *)_local_708)[4] = 0;
      ((ulong *)_local_708)[5] = uVar33;
      *(undefined1 (*) [16])((ulong *)_local_708 + 2) = auVar55 << 0x20;
      *_local_708 = (ImVec2)uVar36;
      ((ulong *)_local_708)[1] = 0;
      ((ulong *)_local_708)[6] = 0;
      *(undefined4 *)((ulong *)_local_708 + 7) = 0;
      *(undefined4 *)((long)_local_708 + 0x3c) = 0x3f800000;
    }
    cVar4 = pIVar31->MouseDown[0];
  }
  if (cVar4 == '\0') {
    _DAT_001fc288 = (float)((uint)_DAT_001fc288 & 0xffffff00);
  }
  uVar36 = (ulong)DAT_001fc39c;
LAB_001304ad:
  local_6a0 = uVar36;
  if ((localBounds != (float *)0x0) && (DAT_001fc288 == '\0')) {
    local_650 = ImGui::GetIO();
    IVar54 = gContext;
    local_658 = (ulong)DAT_001fc34c;
    if (DAT_001fc358 == '\0') {
      fVar59 = DAT_001fc1fc - DAT_001fc11c;
      fVar60 = DAT_001fc200 - _DAT_001fc120;
      fVar57 = DAT_001fc204 - DAT_001fc124;
      fVar61 = 1.0 / SQRT(fVar57 * fVar57 + fVar59 * fVar59 + fVar60 * fVar60);
      local_6f8.x = fVar59 * fVar61;
      local_6d8._0_4_ = fVar60 * fVar61;
      local_6b8.x = fVar61 * fVar57;
      auVar27._12_4_ = 0;
      auVar27._0_12_ = _auStack_704;
      _local_708 = auVar27 << 0x20;
      puVar48 = directionUnary;
      uVar36 = 0;
      do {
        local_518._0_4_ = (undefined4)*(undefined8 *)puVar48;
        local_518._4_4_ = (undefined4)((ulong)*(undefined8 *)puVar48 >> 0x20);
        aIStack_510[0].x = (float)*(undefined8 *)((long)puVar48 + 8);
        aIStack_510[0].y = (float)((ulong)*(undefined8 *)((long)puVar48 + 8) >> 0x20);
        vec_t::TransformVector((vec_t *)local_518,(matrix_t *)&DAT_001fc0ec);
        fVar57 = 1.0 / SQRT(aIStack_510[0].x * aIStack_510[0].x +
                            (float)local_518._0_4_ * (float)local_518._0_4_ +
                            (float)local_518._4_4_ * (float)local_518._4_4_);
        fVar61 = ABS(local_6b8.x * aIStack_510[0].x * fVar57 +
                     local_6f8.x * (float)local_518._0_4_ * fVar57 +
                     (float)local_6d8._0_4_ * (float)local_518._4_4_ * fVar57);
        if ((float)local_708 <= fVar61) {
          local_6c0 = fVar57 * aIStack_510[0].y;
          local_568 = ZEXT416((uint)(aIStack_510[0].x * fVar57));
          local_708 = (undefined1  [4])fVar61;
          local_658 = uVar36 & 0xffffffff;
          local_558 = ZEXT416((uint)((float)local_518._4_4_ * fVar57));
          local_548 = ZEXT416((uint)((float)local_518._0_4_ * fVar57));
        }
        uVar36 = uVar36 + 1;
        puVar48 = (undefined1 *)((long)puVar48 + 0x10);
      } while (uVar36 != 3);
    }
    iVar45 = (int)local_658;
    local_66c = (float)(iVar45 + ((iVar45 + 1) / 3) * -3 + 1);
    local_670 = (float)(iVar45 + ((iVar45 + 2) / 3) * -3 + 2);
    local_530 = (long)(int)local_66c;
    local_538 = (long)(int)local_670;
    uVar36 = 0;
    do {
      (srcMatrix->field_0).m16[iVar45] = 0.0;
      (srcMatrix->field_0).m[0][3] = 0.0;
      uVar46 = (uint)(uVar36 >> 1) & 0x7fffffff;
      (srcMatrix->field_0).m16[local_530] = localBounds[(int)(uVar46 * 3 + (int)local_66c)];
      (srcMatrix->field_0).m16[local_538] =
           localBounds[(int)(((uint)uVar36 & 1 ^ uVar46) * 3 + (int)local_670)];
      uVar36 = uVar36 + 1;
      srcMatrix = (matrix_t *)((srcMatrix->field_0).m + 1);
    } while (uVar36 != 4);
    local_6bc = -1.5673257e-38;
    if (DAT_001fc289 != '\0') {
      local_6bc = -NAN;
    }
    FPU_MatrixF_x_MatrixF((float *)&DAT_001fc0ec,(float *)&DAT_001fc1ac,(float *)local_648);
    fVar57 = 1.0 / SQRT((float)local_568._0_4_ * (float)local_568._0_4_ +
                        (float)local_548._0_4_ * (float)local_548._0_4_ +
                        (float)local_558._0_4_ * (float)local_558._0_4_);
    local_528 = (float)local_548._0_4_ * fVar57;
    fStack_524 = (float)local_558._0_4_ * fVar57;
    local_568._0_4_ = (float)local_568._0_4_ * fVar57;
    local_6c0 = local_6c0 * fVar57;
    local_548._0_4_ = local_528;
    local_558._0_4_ = fStack_524;
    afStack_520[0] = (float)local_548._4_4_;
    afStack_520[1] = (float)local_558._4_4_;
    IVar34.x = 0.0;
    IVar34.y = 0.0;
    local_600 = IVar54;
    do {
      local_6b8 = (ImVec2)((long)local_288 + (long)IVar34 * 0x10);
      IVar53 = worldToPos((vec_t *)local_6b8,(matrix_t *)local_648);
      local_5f8.x = IVar53.x;
      local_5f8.y = IVar53.y;
      local_668 = (ImVec2)((long)IVar34 + 1);
      local_5b8._0_8_ = (vec_t *)(local_288 + (((uint)local_668.x & 3) << 4));
      local_698 = IVar34;
      IVar53 = worldToPos((vec_t *)(local_288 + (((uint)local_668.x & 3) << 4)),
                          (matrix_t *)local_648);
      fVar57 = local_6bc;
      fVar61 = local_5f8.x - IVar53.x;
      fVar59 = local_5f8.y - IVar53.y;
      fVar61 = SQRT(fVar61 * fVar61 + fVar59 * fVar59) / 10.0;
      iVar45 = (int)fVar61;
      if (0 < iVar45) {
        fVar61 = 1.0 / (float)(int)fVar61;
        local_6f8.x = fVar61;
        local_6d8._0_4_ = fVar61 * 0.5;
        iVar40 = 0;
        uStack_700 = extraout_XMM0_Qb;
        local_708 = (undefined1  [4])IVar53.x;
        auStack_704 = (undefined1  [4])IVar53.y;
        do {
          fVar61 = (float)iVar40 * local_6f8.x;
          local_518._0_4_ = fVar61 * ((float)local_708 - local_5f8.x) + local_5f8.x;
          local_518._4_4_ = fVar61 * ((float)auStack_704 - local_5f8.y) + local_5f8.y;
          local_5a8.x = (fVar61 + (float)local_6d8._0_4_) * ((float)local_708 - local_5f8.x) +
                        local_5f8.x;
          local_5a8.y = (fVar61 + (float)local_6d8._0_4_) * ((float)auStack_704 - local_5f8.y) +
                        local_5f8.y;
          ImDrawList::AddLine((ImDrawList *)IVar54,(ImVec2 *)local_518,(ImVec2 *)&local_5a8,
                              (ImU32)fVar57,3.0);
          iVar40 = iVar40 + 1;
        } while (iVar45 != iVar40);
      }
      uStack_700._0_4_ = 0.5;
      _local_708 = (ImVec2 *)0x3f0000003f000000;
      uStack_700._4_4_ = 0.5;
      local_518._0_4_ =
           ((float)*(undefined8 *)local_5b8._0_8_ + (float)*(undefined8 *)local_6b8) * 0.5;
      local_518._4_4_ =
           ((float)((ulong)*(undefined8 *)local_5b8._0_8_ >> 0x20) +
           (float)((ulong)*(undefined8 *)local_6b8 >> 0x20)) * 0.5;
      aIStack_510[0].x =
           ((float)*(undefined8 *)(local_5b8._0_8_ + 8) +
           (float)*(undefined8 *)((long)local_6b8 + 8)) * 0.5;
      aIStack_510[0].y =
           ((float)((ulong)*(undefined8 *)(local_5b8._0_8_ + 8) >> 0x20) +
           (float)((ulong)*(undefined8 *)((long)local_6b8 + 8) >> 0x20)) * 0.5;
      IVar53 = worldToPos((vec_t *)local_518,(matrix_t *)local_648);
      local_5a8.x = IVar53.x;
      local_5a8.y = IVar53.y;
      fVar61 = (local_650->MousePos).x;
      fVar59 = (local_650->MousePos).y;
      fVar60 = local_5a8.x - fVar61;
      fVar61 = local_5f8.x - fVar61;
      fVar62 = local_5a8.y - fVar59;
      fVar59 = local_5f8.y - fVar59;
      iVar40 = -(uint)(fVar60 * fVar60 + fVar62 * fVar62 <= 64.0);
      iVar51 = -(uint)(fVar61 * fVar61 + fVar59 * fVar59 <= 64.0);
      auVar5._4_4_ = iVar40;
      auVar5._0_4_ = iVar40;
      auVar5._8_4_ = iVar51;
      auVar5._12_4_ = iVar51;
      uVar46 = movmskpd(iVar45,auVar5);
      bVar41 = (byte)uVar46;
      fVar61 = fVar57;
      if (bVar41 >> 1 != 0) {
        fVar61 = -1.9207862e+38;
      }
      if ((uVar46 & 1) != 0) {
        fVar57 = -1.9207862e+38;
      }
      ImDrawList::AddCircleFilled((ImDrawList *)IVar54,(ImVec2 *)&local_5f8,8.0,(ImU32)fVar61,0xc);
      ImDrawList::AddCircleFilled((ImDrawList *)IVar54,(ImVec2 *)&local_5a8,6.0,(ImU32)fVar57,0xc);
      IVar54 = local_600;
      fVar57 = local_698.x;
      uVar36 = CONCAT71((int7)((ulong)extraout_RAX >> 8),DAT_001fc358);
      pIVar31 = (ImGuiIO *)CONCAT71((int7)((ulong)extraout_RDX >> 8),DAT_001fc289);
      if ((((DAT_001fc358 == '\0') && (bVar41 >> 1 != 0)) && (((uint)_DAT_001fc288 & 0x100) != 0))
         && (local_650->MouseDown[0] == true)) {
        lVar32 = (ulong)((uint)fVar57 ^ 2) * 0x10;
        puVar37 = (undefined8 *)(local_288 + lVar32);
        _DAT_001fc30c = *puVar37;
        _DAT_001fc314 = *(undefined8 *)(local_288 + lVar32 + 8);
        vec_t::TransformPoint((vec_t *)&DAT_001fc30c,(matrix_t *)&DAT_001fc0ec);
        _DAT_001fc31c = *(undefined8 *)local_6b8;
        _DAT_001fc324 = *(undefined8 *)((long)local_6b8 + 8);
        pvVar43 = (vec_t *)&DAT_001fc0ec;
        vec_t::TransformPoint((vec_t *)&DAT_001fc31c,(matrix_t *)&DAT_001fc0ec);
        fRam00000000001fc334 = local_568._0_4_;
        fRam00000000001fc338 =
             DAT_001fc328 * local_6c0 +
             DAT_001fc324 * fRam00000000001fc334 +
             DAT_001fc31c * (float)local_548._0_4_ + DAT_001fc320 * (float)local_558._0_4_;
        _DAT_001fc32c = local_528;
        fRam00000000001fc330 = fStack_524;
        DAT_001fc34c = (uint)local_658;
        DAT_001fc350 = local_66c;
        DAT_001fc354 = local_670;
        DAT_001fc33c = 0;
        _DAT_001fc344 = 0;
        *(undefined4 *)((long)&DAT_001fc33c + local_530 * 4) =
             *(undefined4 *)((long)puVar37 + local_530 * 4);
        *(undefined4 *)((long)&DAT_001fc33c + local_538 * 4) =
             *(undefined4 *)((long)puVar37 + local_538 * 4);
        DAT_001fc358 = '\x01';
        _DAT_001fc364 = CONCAT44(fRam00000000001fc0f8,_DAT_001fc0f4);
        _DAT_001fc35c = _DAT_001fc0ec;
        _DAT_001fc36c = CONCAT44(DAT_001fc100,DAT_001fc0fc);
        _DAT_001fc374 = _DAT_001fc104;
        _DAT_001fc37c = _DAT_001fc10c;
        _DAT_001fc384 = _DAT_001fc114;
        _DAT_001fc38c = _DAT_001fc11c;
        IRam00000000001fc394 = _DAT_001fc124;
        uVar36 = 1;
        pIVar31 = extraout_RDX_00;
        IVar54 = local_600;
      }
      else {
        bVar41 = ((byte)(uVar36 & 0xffffffff) ^ 1) & DAT_001fc289 & bVar41;
        pvVar43 = (vec_t *)CONCAT71((int7)((uVar36 & 0xffffffff) >> 8),bVar41);
        if ((bVar41 == 1) && (pIVar31 = local_650, local_650->MouseDown[0] == true)) {
          lVar32 = (ulong)((uint)fVar57 ^ 2) * 0x10;
          uVar36 = (ulong)(((int)fVar57 - 1U & 3) << 4);
          uVar2 = *(undefined8 *)(local_288 + lVar32);
          _DAT_001fc30c =
               CONCAT44(((float)((ulong)*(undefined8 *)(local_288 + uVar36) >> 0x20) +
                        (float)((ulong)uVar2 >> 0x20)) * (float)auStack_704,
                        ((float)*(undefined8 *)(local_288 + uVar36) + (float)uVar2) *
                        (float)local_708);
          _DAT_001fc314 =
               CONCAT44(((float)((ulong)*(undefined8 *)(local_288 + uVar36 + 8) >> 0x20) +
                        (float)((ulong)*(undefined8 *)(local_288 + lVar32 + 8) >> 0x20)) *
                        uStack_700._4_4_,
                        ((float)*(undefined8 *)(local_288 + uVar36 + 8) +
                        (float)*(undefined8 *)(local_288 + lVar32 + 8)) * (float)uStack_700);
          vec_t::TransformPoint((vec_t *)&DAT_001fc30c,(matrix_t *)&DAT_001fc0ec);
          _DAT_001fc31c = CONCAT44(local_518._4_4_,local_518._0_4_);
          _DAT_001fc324 = CONCAT44(aIStack_510[0].y,aIStack_510[0].x);
          pvVar43 = (vec_t *)&DAT_001fc0ec;
          vec_t::TransformPoint((vec_t *)&DAT_001fc31c,(matrix_t *)&DAT_001fc0ec);
          fRam00000000001fc334 = local_568._0_4_;
          fRam00000000001fc338 =
               DAT_001fc328 * local_6c0 +
               DAT_001fc324 * fRam00000000001fc334 +
               DAT_001fc31c * (float)local_548._0_4_ + DAT_001fc320 * (float)local_558._0_4_;
          _DAT_001fc32c = local_528;
          fRam00000000001fc330 = fStack_524;
          DAT_001fc34c = (uint)local_658;
          local_308._0_4_ = local_66c;
          local_308._4_4_ = local_670;
          DAT_001fc350 = *(float *)(local_308 + (ulong)((uint)fVar57 & 1) * 4);
          DAT_001fc354 = -NAN;
          DAT_001fc33c = 0;
          _DAT_001fc344 = 0;
          *(undefined4 *)((long)&DAT_001fc33c + (long)(int)DAT_001fc350 * 4) =
               *(undefined4 *)((long)(local_288 + lVar32) + (long)(int)DAT_001fc350 * 4);
          DAT_001fc358 = '\x01';
          _DAT_001fc364 = CONCAT44(fRam00000000001fc0f8,_DAT_001fc0f4);
          _DAT_001fc35c = _DAT_001fc0ec;
          _DAT_001fc36c = CONCAT44(DAT_001fc100,DAT_001fc0fc);
          _DAT_001fc374 = _DAT_001fc104;
          _DAT_001fc37c = _DAT_001fc10c;
          _DAT_001fc384 = _DAT_001fc114;
          _DAT_001fc38c = _DAT_001fc11c;
          IRam00000000001fc394 = _DAT_001fc124;
          uVar36 = 1;
          pIVar31 = extraout_RDX_01;
        }
      }
      IVar34 = local_668;
    } while (local_668 != (ImVec2)0x4);
    if ((char)uVar36 != '\0') {
      local_5f8.x = 1.0;
      local_5f8.y = 0.0;
      local_5f8.z = 0.0;
      local_5f8.w = 0.0;
      fStack_5e8 = 0.0;
      fStack_5e4 = 1.0;
      fStack_5e0 = 0.0;
      uStack_5dc = 0;
      IStack_5d8.x = 0.0;
      IStack_5d8.y = 0.0;
      local_5d0[0] = 1.0;
      local_5d0[1] = 0.0;
      local_5d0[2] = 0.0;
      local_5d0[3] = 0.0;
      local_5d0[4] = 0.0;
      local_5d0[5] = 1.0;
      fVar57 = IntersectRayPlane((vec_t *)&DAT_001fc32c,pvVar43,(vec_t *)pIVar31);
      local_6bc = (DAT_001fc250 * fVar57 + DAT_001fc240) - DAT_001fc310;
      local_5b8 = ZEXT416((uint)ABS((DAT_001fc24c * fVar57 + DAT_001fc23c) - DAT_001fc30c));
      local_698 = (ImVec2)(CONCAT44(extraout_var_02._0_4_,
                                    (fVar57 * DAT_001fc254 + DAT_001fc244) - DAT_001fc314) &
                          0x7fffffff7fffffff);
      uStack_690 = extraout_var_02._4_8_ & 0x7fffffff7fffffff;
      local_6b8.x = DAT_001fc320 - DAT_001fc310;
      _local_6d8 = ZEXT416((uint)ABS(DAT_001fc31c - DAT_001fc30c));
      local_668.y = 0.0;
      local_668.x = ABS(DAT_001fc324 - DAT_001fc314);
      uStack_660 = 0;
      lVar32 = 0;
      bVar39 = true;
      do {
        bVar50 = bVar39;
        lVar32 = (long)(int)(&DAT_001fc350)[lVar32];
        if (lVar32 != -1) {
          fVar61 = ABS((&DAT_001fc364)[lVar32 * 4]) * local_668.x +
                   ABS((&DAT_001fc35c)[lVar32 * 4]) * (float)local_6d8._0_4_ +
                   ABS(local_6b8.x * (&DAT_001fc360)[lVar32 * 4]);
          fVar57 = 1.0;
          if (1.1920929e-07 < fVar61) {
            fVar57 = (ABS((&DAT_001fc364)[lVar32 * 4]) * local_698.x +
                      ABS((&DAT_001fc35c)[lVar32 * 4]) * (float)local_5b8._0_4_ +
                      ABS((&DAT_001fc360)[lVar32 * 4] * local_6bc) + 0.0) / fVar61;
          }
          if (boundsSnap != (float *)0x0) {
            local_6f8.x = localBounds[lVar32 + 3] - localBounds[lVar32];
            local_518._0_4_ = (localBounds[lVar32 + 3] - localBounds[lVar32]) * fVar57;
            _local_708 = ZEXT416((uint)fVar57);
            ComputeSnap((float *)local_518,boundsSnap[lVar32]);
            fVar57 = (float)(~-(uint)(1.1920929e-07 < local_6f8.x) & (uint)local_708 |
                            (uint)((float)local_518._0_4_ / local_6f8.x) &
                            -(uint)(1.1920929e-07 < local_6f8.x));
          }
          fVar61 = (&local_5f8)[lVar32].y;
          fVar59 = (&local_5f8)[lVar32].z;
          fVar60 = (&local_5f8)[lVar32].w;
          (&local_5f8)[lVar32].x = fVar57 * (&local_5f8)[lVar32].x;
          (&local_5f8)[lVar32].y = fVar57 * fVar61;
          (&local_5f8)[lVar32].z = fVar57 * fVar59;
          (&local_5f8)[lVar32].w = fVar57 * fVar60;
        }
        lVar32 = 1;
        bVar39 = false;
      } while (bVar50);
      uStack_2d8 = (uint)DAT_001fc33c;
      uStack_2d4 = (uint)((ulong)DAT_001fc33c >> 0x20);
      local_308._0_4_ = 1.0;
      local_308._4_4_ = 0.0;
      local_308._8_4_ = 0.0;
      uStack_2fc = 0;
      local_2f4 = 0x3f800000;
      local_2f0 = 0;
      uStack_2e8 = 0;
      local_2e0 = 0x3f800000;
      uStack_2dc = 0;
      local_2d0 = DAT_001fc344;
      local_570 = DAT_001fc344 ^ 0x80000000;
      local_5a8.x = 1.0;
      local_5a8.y = 0.0;
      local_5a8.z = 0.0;
      local_5a8.w = 0.0;
      uStack_598 = 0;
      local_594 = 0x3f800000;
      local_590 = 0;
      uStack_588 = 0;
      uStack_578 = uStack_2d8 ^ 0x80000000;
      uStack_574 = uStack_2d4 ^ 0x80000000;
      local_580 = 0x3f800000;
      uStack_57c = 0;
      local_56c = 0x3f800000;
      local_2cc = 0x3f800000;
      FPU_MatrixF_x_MatrixF(&local_5a8.x,&local_5f8.x,&local_2c8[0].x);
      FPU_MatrixF_x_MatrixF(&local_2c8[0].x,(float *)local_308,(float *)local_518);
      FPU_MatrixF_x_MatrixF((float *)local_518,&DAT_001fc35c,&local_88.x);
      local_680[6] = local_58;
      local_680[7] = IStack_50;
      local_680[4] = local_68;
      local_680[5] = IStack_60;
      local_680[2] = local_78;
      local_680[3] = IStack_70;
      *local_680 = local_88;
      local_680[1] = IStack_80;
      IVar53 = worldToPos((vec_t *)&DAT_001fc09c,(matrix_t *)&DAT_001fc1ac);
      uStack_700 = extraout_XMM0_Qb_00;
      local_708 = (undefined1  [4])IVar53.x;
      auStack_704 = (undefined1  [4])IVar53.y;
      ImFormatString(local_518,0x200,"X: %.2f Y: %.2f Z:%.2f",
                     (double)(SQRT(local_5f8.z * local_5f8.z +
                                   local_5f8.x * local_5f8.x + local_5f8.y * local_5f8.y) *
                             SQRT(DAT_001fc364 * DAT_001fc364 +
                                  DAT_001fc35c * DAT_001fc35c + DAT_001fc360 * DAT_001fc360) *
                             (localBounds[3] - *localBounds)),
                     (double)(SQRT(fStack_5e0 * fStack_5e0 +
                                   fStack_5e8 * fStack_5e8 + fStack_5e4 * fStack_5e4) *
                             SQRT(DAT_001fc374 * DAT_001fc374 +
                                  DAT_001fc36c * DAT_001fc36c + DAT_001fc370 * DAT_001fc370) *
                             (localBounds[4] - localBounds[1])),
                     SUB84((double)(SQRT(local_5d0[0] * local_5d0[0] +
                                         IStack_5d8.x * IStack_5d8.x + IStack_5d8.y * IStack_5d8.y)
                                   * SQRT(DAT_001fc384 * DAT_001fc384 +
                                          DAT_001fc37c * DAT_001fc37c + DAT_001fc380 * DAT_001fc380)
                                     * (localBounds[5] - localBounds[2])),0));
      local_2c8[0].x = (float)local_708 + 15.0;
      local_2c8[0].y = (float)auStack_704 + 15.0;
      ImDrawList::AddText((ImDrawList *)IVar54,local_2c8,0xff000000,local_518,(char *)0x0);
      local_2c8[0].x = (float)local_708 + 14.0;
      local_2c8[0].y = (float)auStack_704 + 14.0;
      ImDrawList::AddText((ImDrawList *)IVar54,local_2c8,0xffffffff,local_518,(char *)0x0);
    }
    if (local_650->MouseDown[0] == false) {
      DAT_001fc358 = '\0';
    }
  }
  IVar54 = gContext;
  if (DAT_001fc358 != '\0') {
    return;
  }
  if (local_674 == TRANSLATE) {
    if (gContext == (ImVec2)0x0) {
      return;
    }
    if (DAT_001fc289 == '\0') {
      local_278[0] = 0x99999999;
      local_278[1] = 0x99999999;
      local_278[2] = 0x99999999;
      local_288._0_4_ = -1.5881867e-23;
      local_288._4_4_ = -1.5881867e-23;
      local_288._8_4_ = -1.5881867e-23;
      local_288._12_4_ = -1.5881867e-23;
    }
    else {
      local_288._0_4_ = -(uint)((int)local_6a0 != 7) | 0xff1080ff;
      uVar46 = 0xffffffff;
      lVar32 = 0;
      uVar36 = 0;
      do {
        uVar33 = uVar36 + 1;
        uVar44 = 0xff1080ff;
        uVar42 = 0xff1080ff;
        if (uVar33 != (local_6a0 & 0xffffffff)) {
          uVar42 = *(undefined4 *)((long)&directionColor + lVar32);
        }
        *(undefined4 *)(local_288 + lVar32 + 4) = uVar42;
        if ((uVar36 | 4) != (local_6a0 & 0xffffffff)) {
          uVar36 = (ulong)uVar46;
          if (lVar32 == 0) {
            uVar36 = 2;
          }
          uVar44 = (&directionColor)[uVar36];
        }
        *(undefined4 *)(local_288 + lVar32 + 0x10) = uVar44;
        lVar32 = lVar32 + 4;
        uVar46 = uVar46 + 1;
        uVar36 = uVar33;
      } while (uVar33 != 3);
    }
    ImDrawList::AddRectFilled
              ((ImDrawList *)gContext,(ImVec2 *)&DAT_001fc264,(ImVec2 *)&DAT_001fc26c,
               local_288._0_4_,2.0,-1);
    lVar32 = 0;
    do {
      ComputeTripodAxisAndVisibility
                ((int)lVar32,(vec_t *)local_648,&local_5f8,(bool *)&local_88,(bool *)local_2c8);
      if (local_88.x._0_1_ == '\x01') {
        uStack_700 = 0;
        _local_708 = (ImVec2 *)_local_648;
        local_6f8.y = afStack_644[2];
        local_6f8.x = afStack_644[1];
        uStack_6f0 = 0;
        local_518._0_4_ = (float)_local_648 * 0.1 * DAT_001fc274;
        local_518._4_4_ = (float)((ulong)_local_648 >> 0x20) * 0.1 * DAT_001fc274;
        aIStack_510[0].x = afStack_644[1] * 0.1 * DAT_001fc274;
        aIStack_510[0].y = afStack_644[2] * 0.1 * DAT_001fc274;
        IVar53 = worldToPos((vec_t *)local_518,(matrix_t *)&DAT_001fc16c);
        local_5a8.x = IVar53.x;
        local_5a8.y = IVar53.y;
        local_518._0_4_ = (float)local_708 * DAT_001fc274;
        local_518._4_4_ = (float)auStack_704 * DAT_001fc274;
        aIStack_510[0].x = DAT_001fc274 * local_6f8.x;
        aIStack_510[0].y = DAT_001fc274 * local_6f8.y;
        IVar53 = worldToPos((vec_t *)local_518,(matrix_t *)&DAT_001fc16c);
        local_308._0_4_ = IVar53.x;
        local_308._4_4_ = IVar53.y;
        ImDrawList::AddLine((ImDrawList *)IVar54,(ImVec2 *)&local_5a8,(ImVec2 *)local_308,
                            *(ImU32 *)(local_288 + lVar32 * 4 + 4),6.0);
        if ((float)(&DAT_001fc300)[lVar32] <= 0.0 && (float)(&DAT_001fc300)[lVar32] != 0.0) {
          DrawHatchedAxis((vec_t *)local_648);
        }
      }
      if (local_2c8[0].x._0_1_ == '\x01') {
        aIStack_510[1].x = 0.0;
        aIStack_510[1].y = 0.0;
        aIStack_510[2].x = 0.0;
        aIStack_510[2].y = 0.0;
        local_518._0_4_ = 0.0;
        local_518._4_4_ = 0.0;
        aIStack_510[0].x = 0.0;
        aIStack_510[0].y = 0.0;
        uStack_700 = 0;
        _local_708 = (ImVec2 *)_local_648;
        local_6f8.y = afStack_644[2];
        local_6f8.x = afStack_644[1];
        uStack_6f0 = 0;
        local_6d8._4_4_ = local_5f8.y;
        local_6d8._0_4_ = local_5f8.x;
        _fStack_6d0 = 0;
        local_6b8.y = local_5f8.w;
        local_6b8.x = local_5f8.z;
        uStack_6b0 = 0;
        lVar49 = 0;
        do {
          fVar57 = (float)(&quadUV)[lVar49 * 2];
          fVar61 = (float)(&DAT_001a5bd4)[lVar49 * 2];
          local_5a8.x = ((float)local_6d8._0_4_ * fVar61 + (float)local_708 * fVar57) * DAT_001fc274
          ;
          local_5a8.y = ((float)local_6d8._4_4_ * fVar61 + (float)auStack_704 * fVar57) *
                        DAT_001fc274;
          local_5a8.z = (fVar61 * local_6b8.x + fVar57 * local_6f8.x) * DAT_001fc274;
          local_5a8.w = (fVar61 * local_6b8.y + fVar57 * local_6f8.y) * DAT_001fc274;
          IVar53 = worldToPos(&local_5a8,(matrix_t *)&DAT_001fc16c);
          *(ImVec2 *)(local_518 + lVar49 * 8) = IVar53;
          lVar49 = lVar49 + 1;
        } while (lVar49 != 4);
        ImDrawList::AddConvexPolyFilled
                  ((ImDrawList *)IVar54,(ImVec2 *)local_518,4,
                   *(ImU32 *)(local_288 + lVar32 * 4 + 0x10),true);
      }
      lVar32 = lVar32 + 1;
    } while (lVar32 != 3);
    if (DAT_001fc288 == '\0') {
      return;
    }
    IVar53 = worldToPos((vec_t *)&DAT_001fc2ac,(matrix_t *)&DAT_001fc1ac);
    uStack_700 = extraout_XMM0_Qb_02;
    local_708 = (undefined1  [4])IVar53.x;
    auStack_704 = (undefined1  [4])IVar53.y;
    local_5f8.x = IVar53.x;
    local_5f8.y = IVar53.y;
    local_6f8 = worldToPos((vec_t *)&DAT_001fc09c,(matrix_t *)&DAT_001fc1ac);
    local_5a8.x = local_6f8.x;
    local_5a8.y = local_6f8.y;
    uStack_6f0 = extraout_XMM0_Qb_03;
    ImDrawList::AddCircle((ImDrawList *)IVar54,(ImVec2 *)&local_5f8,6.0,0xaaaaaaaa,0xc,1.0);
    ImDrawList::AddCircle((ImDrawList *)IVar54,(ImVec2 *)&local_5a8,6.0,0xaaaaaaaa,0xc,1.0);
    fVar61 = local_6f8.x - (float)local_708;
    fVar59 = local_6f8.y - (float)auStack_704;
    fVar57 = 1.0 / SQRT(fVar61 * fVar61 + fVar59 * fVar59);
    fVar61 = fVar57 * fVar61 * 5.0;
    fVar57 = fVar57 * fVar59 * 5.0;
    local_518._0_4_ = local_5f8.x + fVar61;
    local_518._4_4_ = local_5f8.y + fVar57;
    _local_648 = CONCAT44(local_5a8.y - fVar57,local_5a8.x - fVar61);
    ImDrawList::AddLine((ImDrawList *)IVar54,(ImVec2 *)local_518,(ImVec2 *)local_648,0xaaaaaaaa,2.0)
    ;
    _local_648 = CONCAT44(DAT_001fc09c._4_4_ - DAT_001fc2ac.y,DAT_001fc09c - DAT_001fc2ac.x);
    afStack_644[1] = DAT_001fc0a4 - DAT_001fc2b4.x;
    afStack_644[2] = DAT_001fc0a4._4_4_ - DAT_001fc2b4.y;
    lVar32 = (long)((int)local_6a0 * 3 + -3);
    buf = local_518;
    ImFormatString(buf,0x200,
                   _ZN8ImGuizmoL19translationInfoMaskE_rel +
                   *(int *)(_ZN8ImGuizmoL16rotationInfoMaskE_rel + (long)(int)local_6a0 * 4 + 0xc),
                   (double)*(float *)(local_648 +
                                     (long)*(int *)(translationInfoIndex + lVar32 * 4) * 4),
                   (double)*(float *)(local_648 +
                                     (long)*(int *)(translationInfoIndex + lVar32 * 4 + 4) * 4),
                   SUB84((double)*(float *)(local_648 +
                                           (long)*(int *)(translationInfoIndex + lVar32 * 4 + 8) * 4
                                           ),0));
    local_308._0_4_ = local_5a8.x + 15.0;
    local_308._4_4_ = local_5a8.y + 15.0;
    ImDrawList::AddText((ImDrawList *)IVar54,(ImVec2 *)local_308,0xff000000,buf,(char *)0x0);
    local_308._0_4_ = local_5a8.x + 14.0;
    local_308._4_4_ = local_5a8.y + 14.0;
    pvVar43 = (vec_t *)local_308;
  }
  else if (local_674 == SCALE) {
    local_6d8._0_4_ = gContext.x;
    local_6d8._4_4_ = gContext.y;
    if (DAT_001fc289 == '\0') {
      local_278[0] = 0x99999999;
      local_278[1] = 0x99999999;
      local_278[2] = 0x99999999;
      local_288._0_4_ = -1.5881867e-23;
      local_288._4_4_ = -1.5881867e-23;
      local_288._8_4_ = -1.5881867e-23;
      local_288._12_4_ = -1.5881867e-23;
    }
    else {
      local_288._0_4_ = -(uint)((int)local_6a0 != 0xf) | 0xff1080ff;
      lVar32 = 0;
      do {
        uVar42 = 0xff1080ff;
        if ((local_6a0 & 0xffffffff) * 4 + -0x30 != lVar32) {
          uVar42 = *(undefined4 *)((long)&directionColor + lVar32);
        }
        *(undefined4 *)(local_288 + lVar32 + 4) = uVar42;
        lVar32 = lVar32 + 4;
      } while (lVar32 != 0xc);
    }
    ImDrawList::AddCircleFilled
              ((ImDrawList *)gContext,(ImVec2 *)&DAT_001fc25c,12.0,local_288._0_4_,0x20);
    _local_648 = 0x3f8000003f800000;
    afStack_644[1] = 1.0;
    afStack_644[2] = 1.0;
    if (DAT_001fc288 == '\x01') {
      _local_648 = _DAT_001fc2d4;
      afStack_644[1] = (float)_DAT_001fc2dc;
      afStack_644[2] = (float)(_DAT_001fc2dc >> 0x20);
    }
    lVar32 = 0;
    do {
      ComputeTripodAxisAndVisibility
                ((int)lVar32,(vec_t *)local_518,&local_5f8,&local_709,&local_6d9);
      if (local_709 != false) {
        auStack_704 = (undefined1  [4])local_518._4_4_;
        local_708 = (undefined1  [4])local_518._0_4_;
        uStack_700 = 0;
        local_6f8.x = aIStack_510[0].x;
        local_6f8.y = aIStack_510[0].y;
        uStack_6f0 = 0;
        local_5a8.x = (float)local_518._0_4_ * 0.1 * DAT_001fc274;
        local_5a8.y = (float)local_518._4_4_ * 0.1 * DAT_001fc274;
        local_5a8.z = aIStack_510[0].x * 0.1 * DAT_001fc274;
        local_5a8.w = aIStack_510[0].y * 0.1 * DAT_001fc274;
        IVar54 = worldToPos(&local_5a8,(matrix_t *)&DAT_001fc16c);
        local_308._0_4_ = IVar54.x;
        local_308._4_4_ = IVar54.y;
        local_5a8.x = (float)local_708 * DAT_001fc274;
        local_5a8.y = (float)auStack_704 * DAT_001fc274;
        local_5a8.z = DAT_001fc274 * local_6f8.x;
        local_5a8.w = DAT_001fc274 * local_6f8.y;
        local_88 = worldToPos(&local_5a8,(matrix_t *)&DAT_001fc16c);
        fVar57 = *(float *)(local_648 + lVar32 * 4);
        local_708 = (undefined1  [4])((float)local_708 * fVar57);
        auStack_704 = (undefined1  [4])((float)auStack_704 * fVar57);
        uStack_700._0_4_ = (float)uStack_700 * fVar57;
        uStack_700._4_4_ = uStack_700._4_4_ * fVar57;
        local_5a8.x = (float)local_708 * DAT_001fc274;
        local_5a8.y = (float)auStack_704 * DAT_001fc274;
        local_6f8.x = fVar57 * local_6f8.x;
        local_6f8.y = fVar57 * local_6f8.y;
        uStack_6f0 = CONCAT44(fVar57 * uStack_6f0._4_4_,fVar57 * (float)uStack_6f0);
        local_5a8.z = DAT_001fc274 * local_6f8.x;
        local_5a8.w = DAT_001fc274 * local_6f8.y;
        local_2c8[0] = worldToPos(&local_5a8,(matrix_t *)&DAT_001fc16c);
        if (DAT_001fc288 == '\x01') {
          auVar30 = local_6d8;
          ImDrawList::AddLine((ImDrawList *)local_6d8,(ImVec2 *)local_308,&local_88,0xff404040,6.0);
          ImDrawList::AddCircleFilled((ImDrawList *)auVar30,&local_88,10.0,0xff404040,0xc);
        }
        col = *(ImU32 *)(local_288 + lVar32 * 4 + 4);
        auVar30 = local_6d8;
        ImDrawList::AddLine((ImDrawList *)local_6d8,(ImVec2 *)local_308,local_2c8,col,6.0);
        ImDrawList::AddCircleFilled((ImDrawList *)auVar30,local_2c8,10.0,col,0xc);
        if ((float)(&DAT_001fc300)[lVar32] <= 0.0 && (float)(&DAT_001fc300)[lVar32] != 0.0) {
          local_5a8.x = local_708;
          local_5a8.y = local_708._4_4_;
          local_5a8.z = local_6f8.x;
          local_5a8.w = local_6f8.y;
          DrawHatchedAxis(&local_5a8);
        }
      }
      lVar32 = lVar32 + 1;
    } while (lVar32 != 3);
    if (DAT_001fc288 == '\0') {
      return;
    }
    IVar54 = worldToPos((vec_t *)&DAT_001fc09c,(matrix_t *)&DAT_001fc1ac);
    uStack_700 = extraout_XMM0_Qb_01;
    local_708 = (undefined1  [4])IVar54.x;
    auStack_704 = (undefined1  [4])IVar54.y;
    buf = local_518;
    ImFormatString(buf,0x200,
                   _ZN8ImGuizmoL13scaleInfoMaskE_rel +
                   *(int *)(translationInfoIndex + (long)(int)local_6a0 * 4 + 0x24),
                   (double)*(float *)(local_648 +
                                     (long)*(int *)(translationInfoIndex +
                                                   (long)((int)local_6a0 * 3 + -0x24) * 4) * 4));
    local_5f8.x = (float)local_708 + 15.0;
    local_5f8.y = (float)auStack_704 + 15.0;
    IVar54 = (ImVec2)local_6d8;
    ImDrawList::AddText((ImDrawList *)local_6d8,(ImVec2 *)&local_5f8,0xff000000,buf,(char *)0x0);
    local_5f8.x = (float)local_708 + 14.0;
    local_5f8.y = (float)auStack_704 + 14.0;
    pvVar43 = &local_5f8;
  }
  else {
    if (local_674 != ROTATE) {
      return;
    }
    local_698 = gContext;
    ImGui::GetIO();
    if (DAT_001fc289 == '\0') {
      afStack_644[3] = -1.5881867e-23;
      afStack_644[4] = -1.5881867e-23;
      afStack_644[5] = -1.5881867e-23;
      _local_648 = 0x9999999999999999;
      afStack_644[1] = -1.5881867e-23;
      afStack_644[2] = -1.5881867e-23;
    }
    else {
      _local_648 = CONCAT44(afStack_644[0],-(uint)((int)local_6a0 != 0xb)) | 0xff1080ff;
      lVar32 = 0;
      do {
        uVar42 = 0xff1080ff;
        if ((local_6a0 & 0xffffffff) * 4 + -0x20 != lVar32) {
          uVar42 = *(undefined4 *)((long)&directionColor + lVar32);
        }
        *(undefined4 *)(local_648 + lVar32 + 4) = uVar42;
        lVar32 = lVar32 + 4;
      } while (lVar32 != 0xc);
    }
    local_5f8.z = DAT_001fc0a4 - DAT_001fc204;
    local_5f8.x = DAT_001fc09c - DAT_001fc1fc;
    local_5f8.y = DAT_001fc09c._4_4_ - DAT_001fc1fc._4_4_;
    local_5f8.w = 1.0 / SQRT(local_5f8.z * local_5f8.z +
                             local_5f8.x * local_5f8.x + local_5f8.y * local_5f8.y);
    local_5f8.x = local_5f8.x * local_5f8.w;
    local_5f8.y = local_5f8.y * local_5f8.w;
    local_5f8.z = local_5f8.w * local_5f8.z;
    local_5f8.w = local_5f8.w * (DAT_001fc0a4._4_4_ - DAT_001fc204._4_4_);
    vec_t::TransformVector(&local_5f8,(matrix_t *)&DAT_001fc0ac);
    IVar38.x = 0.0;
    IVar38.y = 0.0;
    do {
      memset(local_518,0,0x200);
      fVar57 = IVar38.x;
      uVar36 = (ulong)(1 - (int)fVar57);
      if (IVar38 == (ImVec2)0x2) {
        uVar36 = 2;
      }
      local_6b8 = (ImVec2)(3 - (long)IVar38);
      uVar33 = (ulong)local_6b8 & 0xffffffff;
      if (IVar38 == (ImVec2)0x0) {
        uVar33 = 0;
      }
      fVar61 = atan2f((&local_5f8.x)[uVar36],(&local_5f8.x)[uVar33]);
      local_668 = (ImVec2)((long)IVar38 + 1);
      IVar47 = local_668;
      if (local_668 == (ImVec2)0x3) {
        IVar47.x = 0.0;
        IVar47.y = 0.0;
      }
      local_6d8._0_4_ = fVar61 + 1.5707964;
      lVar32 = 0;
      do {
        fVar61 = (float)(int)lVar32 * 0.015625 * 3.1415927 + (float)local_6d8._0_4_;
        local_6f8.x = fVar61;
        local_708 = (undefined1  [4])cosf(fVar61);
        auStack_704 = (undefined1  [4])extraout_XMM0_Db;
        uStack_700._0_4_ = (float)extraout_XMM0_Dc;
        uStack_700._4_4_ = (float)extraout_XMM0_Dd;
        local_288._4_4_ = sinf(local_6f8.x);
        local_288._0_4_ = local_708;
        local_288._8_4_ = 0.0;
        local_288._12_4_ = 0.0;
        local_5a8.x = *(float *)(local_288 + (long)IVar38 * 4) * DAT_001fc274;
        local_5a8.y = *(float *)(local_288 + (long)IVar47 * 4) * DAT_001fc274;
        local_5a8.z = *(float *)(local_288 +
                                (ulong)((int)fVar57 + (((int)fVar57 + 2U) / 3) * -3 + 2) * 4) *
                      DAT_001fc274;
        local_5a8.w = DAT_001fc274 * 0.0;
        IVar54 = worldToPos(&local_5a8,(matrix_t *)&DAT_001fc16c);
        *(ImVec2 *)(local_518 + lVar32 * 8) = IVar54;
        lVar32 = lVar32 + 1;
      } while (lVar32 != 0x40);
      ImDrawList::AddPolyline
                ((ImDrawList *)local_698,(ImVec2 *)local_518,0x40,
                 *(ImU32 *)(local_648 + (long)local_6b8 * 4),false,2.0,true);
      IVar38 = local_668;
    } while (local_668 != (ImVec2)0x3);
    IVar54 = worldToPos((vec_t *)&DAT_001fc09c,(matrix_t *)&DAT_001fc1ac);
    local_518._0_4_ = IVar54.x;
    local_518._4_4_ = IVar54.y;
    ImDrawList::AddCircle
              ((ImDrawList *)local_698,(ImVec2 *)local_518,DAT_001fc3a8._4_4_ * 0.06,
               (ImU32)local_648,0x40,1.0);
    if (DAT_001fc288 == '\0') {
      return;
    }
    uVar36 = 0;
    memset(local_518,0,0x208);
    IVar54 = worldToPos((vec_t *)&DAT_001fc09c,(matrix_t *)&DAT_001fc1ac);
    local_518._0_4_ = IVar54.x;
    local_518._4_4_ = IVar54.y;
    do {
      matrix_t::RotationAxis
                ((matrix_t *)local_288,(vec_t *)&DAT_001fc28c,
                 ((float)(uVar36 & 0xffffffff) / 63.0) * DAT_001fc2cc);
      local_5a8.x = DAT_001fc09c +
                    ((float)local_278[8] +
                    (float)local_278._16_8_ * _DAT_001fc2c4 +
                    (float)local_288._0_4_ * _DAT_001fc2bc + (float)local_278[0] * _DAT_001fc2c0) *
                    DAT_001fc274;
      local_5a8.y = DAT_001fc09c._4_4_ +
                    ((float)local_278[9] +
                    SUB84(local_278._16_8_,4) * _DAT_001fc2c4 +
                    (float)local_288._4_4_ * _DAT_001fc2bc + (float)local_278[1] * _DAT_001fc2c0) *
                    DAT_001fc274;
      local_5a8.z = DAT_001fc0a4 +
                    ((float)local_278[10] +
                    (float)local_278[6] * _DAT_001fc2c4 +
                    _DAT_001fc2bc * (float)local_288._8_4_ + (float)local_278[2] * _DAT_001fc2c0) *
                    DAT_001fc274;
      local_5a8.w = DAT_001fc0a4._4_4_ +
                    ((float)local_278[0xb] +
                    (float)local_278[7] * _DAT_001fc2c4 +
                    _DAT_001fc2bc * (float)local_288._12_4_ + (float)local_278[3] * _DAT_001fc2c0) *
                    DAT_001fc274;
      IVar53 = worldToPos(&local_5a8,(matrix_t *)&DAT_001fc1ac);
      IVar54 = local_698;
      aIStack_510[uVar36] = IVar53;
      uVar36 = uVar36 + 1;
    } while (uVar36 != 0x3f);
    ImDrawList::AddConvexPolyFilled
              ((ImDrawList *)local_698,(ImVec2 *)local_518,0x40,0x801080ff,true);
    ImDrawList::AddPolyline((ImDrawList *)IVar54,(ImVec2 *)local_518,0x40,0xff1080ff,true,2.0,true);
    auStack_704 = (undefined1  [4])aIStack_510[0].y;
    local_708 = (undefined1  [4])aIStack_510[0].x;
    uStack_700 = 0;
    buf = local_288;
    ImFormatString(buf,0x200,
                   _ZN8ImGuizmoL16rotationInfoMaskE_rel +
                   *(int *)("Y : %5.2f" + (long)(int)local_6a0 * 4 + 8),
                   (double)((DAT_001fc2cc / 3.1415927) * 180.0),(double)DAT_001fc2cc);
    local_5a8.x = (float)local_708 + 15.0;
    local_5a8.y = (float)auStack_704 + 15.0;
    ImDrawList::AddText((ImDrawList *)IVar54,(ImVec2 *)&local_5a8,0xff000000,buf,(char *)0x0);
    local_5a8.x = (float)local_708 + 14.0;
    local_5a8.y = (float)auStack_704 + 14.0;
    pvVar43 = &local_5a8;
  }
  ImDrawList::AddText((ImDrawList *)IVar54,(ImVec2 *)pvVar43,0xffffffff,buf,(char *)0x0);
  return;
}

Assistant:

void Manipulate(const float *view, const float *projection, OPERATION operation, MODE mode, float *matrix, float *deltaMatrix, float *snap, float *localBounds, float *boundsSnap)
   {
      ComputeContext(view, projection, matrix, mode);

      // set delta to identity 
      if (deltaMatrix)
         ((matrix_t*)deltaMatrix)->SetToIdentity();

      // behind camera
      vec_t camSpacePosition;
      camSpacePosition.TransformPoint(makeVect(0.f, 0.f, 0.f), gContext.mMVP);
      if (camSpacePosition.z < 0.001f)
         return;

      // -- 
      int type = NONE;
      if (gContext.mbEnable)
      {
		  if (!gContext.mbUsingBounds)
		  {
			  switch (operation)
			  {
			  case ROTATE:
				  HandleRotation(matrix, deltaMatrix, type, snap);
				  break;
			  case TRANSLATE:
				  HandleTranslation(matrix, deltaMatrix, type, snap);
				  break;
			  case SCALE:
				  HandleScale(matrix, deltaMatrix, type, snap);
				  break;
			  }
		  }
      }

	  if (localBounds && !gContext.mbUsing)
		  HandleAndDrawLocalBounds(localBounds, (matrix_t*)matrix, boundsSnap);

	  if (!gContext.mbUsingBounds)
	  {
		  switch (operation)
		  {
		  case ROTATE:
			  DrawRotationGizmo(type);
			  break;
		  case TRANSLATE:
			  DrawTranslationGizmo(type);
			  break;
		  case SCALE:
			  DrawScaleGizmo(type);
			  break;
		  }
	  }
   }